

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O2

void embree::sse42::
     BVHNIntersectorKHybrid<4,_4,_1,_false,_embree::sse42::SubGridIntersectorKMoeller<4,_4,_true>,_true>
     ::occluded(vint<4> *valid_i,Intersectors *This,RayK<4> *ray,RayQueryContext *context)

{
  long lVar1;
  undefined8 *puVar2;
  undefined8 *puVar3;
  undefined8 uVar4;
  ushort uVar5;
  BVH *bvh;
  Geometry *pGVar6;
  long lVar7;
  long lVar8;
  RTCFilterFunctionN p_Var9;
  Ref<embree::Geometry> *pRVar10;
  bool bVar11;
  bool bVar12;
  byte bVar13;
  byte bVar14;
  byte bVar15;
  byte bVar16;
  byte bVar17;
  byte bVar18;
  byte bVar19;
  byte bVar20;
  undefined1 auVar21 [16];
  byte bVar22;
  undefined1 auVar23 [12];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined8 uVar28;
  undefined8 uVar29;
  uint uVar30;
  undefined4 uVar31;
  int iVar32;
  ulong uVar33;
  RTCIntersectArguments *pRVar34;
  long lVar35;
  RTCIntersectArguments *pRVar36;
  RTCIntersectArguments *pRVar37;
  ulong uVar38;
  long lVar39;
  size_t sVar40;
  ulong uVar41;
  uint uVar42;
  Intersectors *pIVar43;
  size_t sVar44;
  long lVar45;
  NodeRef *pNVar46;
  vfloat<4> *pvVar47;
  vfloat<4> *pvVar48;
  uint i_1;
  ulong uVar49;
  NodeRef root;
  ulong uVar50;
  bool bVar51;
  float fVar52;
  float fVar53;
  float fVar74;
  float fVar75;
  vint4 bi_1;
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  float fVar76;
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  byte bVar77;
  float fVar78;
  byte bVar90;
  byte bVar91;
  byte bVar93;
  float fVar94;
  byte bVar96;
  byte bVar97;
  float fVar98;
  vint4 bi;
  undefined1 auVar79 [16];
  float fVar99;
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  byte bVar92;
  float fVar95;
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  float fVar100;
  float fVar104;
  float fVar105;
  vint4 ai;
  float fVar106;
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  float fVar107;
  float fVar113;
  float fVar116;
  vint4 ai_1;
  undefined1 auVar108 [16];
  float fVar118;
  undefined1 auVar109 [16];
  float fVar114;
  float fVar117;
  undefined1 auVar110 [16];
  undefined1 auVar115 [12];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  float fVar119;
  float fVar120;
  float fVar131;
  float fVar132;
  vint4 ai_3;
  float fVar133;
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar124;
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  float fVar134;
  uint uVar141;
  uint uVar143;
  vint4 bi_2;
  undefined1 auVar135 [16];
  uint uVar145;
  undefined1 auVar136 [16];
  float fVar142;
  float fVar144;
  float fVar146;
  float fVar147;
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  float fVar148;
  float fVar149;
  uint uVar150;
  float fVar151;
  float fVar154;
  float fVar158;
  vint4 bi_3;
  float fVar155;
  uint uVar156;
  float fVar157;
  float fVar159;
  uint uVar160;
  float fVar161;
  float fVar162;
  float fVar163;
  uint uVar164;
  float fVar165;
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  uint uVar166;
  float fVar167;
  float fVar168;
  uint uVar173;
  uint uVar176;
  vint4 ai_2;
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  float fVar174;
  float fVar175;
  float fVar177;
  float fVar178;
  uint uVar179;
  float fVar180;
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  uint uVar181;
  float fVar182;
  uint uVar184;
  float fVar185;
  float fVar186;
  float fVar187;
  float fVar191;
  float fVar192;
  float fVar193;
  float fVar194;
  float fVar195;
  float fVar196;
  float fVar197;
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  float fVar198;
  undefined4 in_XMM13_Da;
  float fVar199;
  undefined4 in_XMM13_Db;
  float fVar200;
  undefined4 in_XMM13_Dc;
  float fVar201;
  undefined4 in_XMM13_Dd;
  float fVar202;
  float fVar203;
  float fVar206;
  float fVar207;
  undefined1 in_XMM14 [16];
  float fVar208;
  undefined1 auVar204 [16];
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar205;
  float fVar209;
  float fVar212;
  float fVar213;
  undefined1 in_XMM15 [16];
  float fVar214;
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 local_1c58 [8];
  float fStack_1c50;
  float fStack_1c4c;
  undefined1 local_1c48 [16];
  Precalculations pre;
  undefined1 local_1c28 [16];
  float local_1c18;
  undefined1 auStack_1c14 [8];
  float fStack_1c0c;
  undefined1 local_1c08 [8];
  float fStack_1c00;
  float fStack_1bfc;
  undefined1 local_1bf8 [8];
  float fStack_1bf0;
  float fStack_1bec;
  undefined8 local_1be8;
  undefined8 uStack_1be0;
  undefined8 local_1bd8;
  undefined8 uStack_1bd0;
  undefined8 local_1bc8;
  undefined8 uStack_1bc0;
  undefined1 local_1ba8 [8];
  float fStack_1ba0;
  float fStack_1b9c;
  undefined1 local_1b98 [8];
  undefined8 uStack_1b90;
  float local_1b88;
  vfloat<4> lower_y;
  vfloat<4> lower_z;
  float local_1b08;
  float fStack_1b04;
  float fStack_1b00;
  float fStack_1afc;
  vbool<4> terminated;
  float local_1ac8;
  float fStack_1ac4;
  float fStack_1ac0;
  float fStack_1abc;
  vfloat<4> upper_z;
  RTCIntersectArguments *local_1a98;
  vfloat<4> upper_x;
  RTCIntersectArguments local_1a18;
  vfloat<4> t;
  vfloat<4> v;
  vfloat<4> upper_y;
  undefined8 local_1978;
  undefined8 uStack_1970;
  undefined8 local_1968;
  undefined8 uStack_1960;
  TravRayK<4,_false> tray;
  vfloat<4> lower_x;
  undefined1 local_17a8 [16];
  RTCFilterFunctionN local_1798;
  RTCIntersectFunctionN p_Stack_1790;
  undefined1 local_1788 [16];
  undefined8 local_1778;
  undefined8 uStack_1770;
  undefined8 local_1768;
  undefined8 uStack_1760;
  undefined1 local_1758 [16];
  undefined8 local_1748;
  undefined8 uStack_1740;
  undefined1 local_1738 [16];
  undefined1 local_1728 [16];
  undefined8 local_1718;
  undefined8 uStack_1710;
  undefined8 local_1708;
  undefined8 uStack_1700;
  undefined8 local_16f8;
  undefined8 uStack_16f0;
  undefined1 local_16e8 [16];
  NodeRef stack_node [241];
  vfloat<4> stack_near [241];
  undefined1 auVar183 [16];
  
  uVar29 = mm_lookupmask_ps._8_8_;
  uVar28 = mm_lookupmask_ps._0_8_;
  bvh = (BVH *)This->ptr;
  stack_node[1].ptr = (bvh->root).ptr;
  if (stack_node[1].ptr != 8) {
    if ((context->user != (RTCRayQueryContext *)0x0) &&
       (((ulong)*(Scene **)&context->args->flags & 0x10000) != 0)) {
      occludedCoherent((BVHNIntersectorKHybrid<4,_4,_1,_false,_embree::sse42::SubGridIntersectorKMoeller<4,_4,_true>,_true>
                        *)valid_i,(vint<4> *)This,(Intersectors *)ray,(RayK<4> *)context,
                       (RayQueryContext *)context->args);
      return;
    }
    auVar83._8_4_ = 0xffffffff;
    auVar83._0_8_ = 0xffffffffffffffff;
    auVar83._12_4_ = 0xffffffff;
    auVar89 = *(undefined1 (*) [16])(ray + 0x80);
    auVar108._0_12_ = ZEXT812(0);
    auVar108._12_4_ = 0;
    uVar181 = -(uint)((valid_i->field_0).i[0] == -1 && 0.0 <= auVar89._0_4_);
    uVar184 = -(uint)((valid_i->field_0).i[1] == -1 && 0.0 <= auVar89._4_4_);
    auVar183._0_8_ = CONCAT44(uVar184,uVar181);
    auVar183._8_4_ = -(uint)((valid_i->field_0).i[2] == -1 && 0.0 <= auVar89._8_4_);
    auVar183._12_4_ = -(uint)((valid_i->field_0).i[3] == -1 && 0.0 <= auVar89._12_4_);
    uVar42 = movmskps((int)valid_i,auVar183);
    pIVar43 = (Intersectors *)(ulong)uVar42;
    if (uVar42 != 0) {
      tray.org.field_0._0_8_ = *(undefined8 *)ray;
      tray.org.field_0._8_8_ = *(undefined8 *)(ray + 8);
      tray.org.field_0._16_8_ = *(undefined8 *)(ray + 0x10);
      tray.org.field_0._24_8_ = *(undefined8 *)(ray + 0x18);
      tray.org.field_0._32_8_ = *(undefined8 *)(ray + 0x20);
      tray.org.field_0._40_8_ = *(undefined8 *)(ray + 0x28);
      tray.dir.field_0.field_0.x.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x40);
      tray.dir.field_0.field_0.y.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x50);
      tray.dir.field_0.field_0.z.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x60);
      fVar148 = (float)DAT_01f4bd50;
      fVar154 = DAT_01f4bd50._4_4_;
      fVar158 = DAT_01f4bd50._8_4_;
      fVar162 = DAT_01f4bd50._12_4_;
      auVar55._4_4_ = -(uint)(ABS(tray.dir.field_0._4_4_) < fVar154);
      auVar55._0_4_ = -(uint)(ABS(tray.dir.field_0._0_4_) < fVar148);
      auVar55._8_4_ = -(uint)(ABS(tray.dir.field_0._8_4_) < fVar158);
      auVar55._12_4_ = -(uint)(ABS(tray.dir.field_0._12_4_) < fVar162);
      auVar169 = blendvps((undefined1  [16])tray.dir.field_0.field_0.x.field_0,_DAT_01f4bd50,auVar55
                         );
      auVar79._4_4_ = -(uint)(ABS(tray.dir.field_0._20_4_) < fVar154);
      auVar79._0_4_ = -(uint)(ABS(tray.dir.field_0._16_4_) < fVar148);
      auVar79._8_4_ = -(uint)(ABS(tray.dir.field_0._24_4_) < fVar158);
      auVar79._12_4_ = -(uint)(ABS(tray.dir.field_0._28_4_) < fVar162);
      auVar79 = blendvps((undefined1  [16])tray.dir.field_0.field_0.y.field_0,_DAT_01f4bd50,auVar79)
      ;
      auVar54._4_4_ = -(uint)(ABS(tray.dir.field_0._36_4_) < fVar154);
      auVar54._0_4_ = -(uint)(ABS(tray.dir.field_0._32_4_) < fVar148);
      auVar54._8_4_ = -(uint)(ABS(tray.dir.field_0._40_4_) < fVar158);
      auVar54._12_4_ = -(uint)(ABS(tray.dir.field_0._44_4_) < fVar162);
      auVar135 = blendvps((undefined1  [16])tray.dir.field_0.field_0.z.field_0,_DAT_01f4bd50,auVar54
                         );
      auVar55 = rcpps(auVar54,auVar169);
      fVar148 = auVar55._0_4_;
      auVar170._0_4_ = auVar169._0_4_ * fVar148;
      fVar154 = auVar55._4_4_;
      auVar170._4_4_ = auVar169._4_4_ * fVar154;
      fVar158 = auVar55._8_4_;
      auVar170._8_4_ = auVar169._8_4_ * fVar158;
      fVar162 = auVar55._12_4_;
      auVar170._12_4_ = auVar169._12_4_ * fVar162;
      tray.rdir.field_0._0_4_ = (1.0 - auVar170._0_4_) * fVar148 + fVar148;
      tray.rdir.field_0._4_4_ = (1.0 - auVar170._4_4_) * fVar154 + fVar154;
      tray.rdir.field_0._8_4_ = (1.0 - auVar170._8_4_) * fVar158 + fVar158;
      tray.rdir.field_0._12_4_ = (1.0 - auVar170._12_4_) * fVar162 + fVar162;
      auVar55 = rcpps(auVar170,auVar79);
      fVar148 = auVar55._0_4_;
      fVar154 = auVar55._4_4_;
      fVar158 = auVar55._8_4_;
      fVar162 = auVar55._12_4_;
      tray.rdir.field_0._16_4_ = (1.0 - auVar79._0_4_ * fVar148) * fVar148 + fVar148;
      tray.rdir.field_0._20_4_ = (1.0 - auVar79._4_4_ * fVar154) * fVar154 + fVar154;
      tray.rdir.field_0._24_4_ = (1.0 - auVar79._8_4_ * fVar158) * fVar158 + fVar158;
      tray.rdir.field_0._28_4_ = (1.0 - auVar79._12_4_ * fVar162) * fVar162 + fVar162;
      auVar55 = rcpps(auVar55,auVar135);
      fVar148 = auVar55._0_4_;
      fVar154 = auVar55._4_4_;
      fVar158 = auVar55._8_4_;
      fVar162 = auVar55._12_4_;
      tray.rdir.field_0._32_4_ = (1.0 - auVar135._0_4_ * fVar148) * fVar148 + fVar148;
      tray.rdir.field_0._36_4_ = (1.0 - auVar135._4_4_ * fVar154) * fVar154 + fVar154;
      tray.rdir.field_0._40_4_ = (1.0 - auVar135._8_4_ * fVar158) * fVar158 + fVar158;
      tray.rdir.field_0._44_4_ = (1.0 - auVar135._12_4_ * fVar162) * fVar162 + fVar162;
      auVar135._4_4_ = -(uint)(0.0 <= (float)tray.rdir.field_0._20_4_);
      auVar135._0_4_ = -(uint)(0.0 <= (float)tray.rdir.field_0._16_4_);
      auVar135._8_4_ = -(uint)(0.0 <= (float)tray.rdir.field_0._24_4_);
      auVar135._12_4_ = -(uint)(0.0 <= (float)tray.rdir.field_0._28_4_);
      tray.nearXYZ.field_0.field_0.y.field_0 =
           (vint_impl<4>)blendvps(_DAT_01f79fd0,_DAT_01f57210,auVar135);
      tray.nearXYZ.field_0._0_4_ = -(uint)((float)tray.rdir.field_0._0_4_ < 0.0) & 0x10;
      tray.nearXYZ.field_0._4_4_ = -(uint)((float)tray.rdir.field_0._4_4_ < 0.0) & 0x10;
      tray.nearXYZ.field_0._8_4_ = -(uint)((float)tray.rdir.field_0._8_4_ < 0.0) & 0x10;
      tray.nearXYZ.field_0._12_4_ = -(uint)((float)tray.rdir.field_0._12_4_ < 0.0) & 0x10;
      auVar169._4_4_ = -(uint)(0.0 <= (float)tray.rdir.field_0._36_4_);
      auVar169._0_4_ = -(uint)(0.0 <= (float)tray.rdir.field_0._32_4_);
      auVar169._8_4_ = -(uint)(0.0 <= (float)tray.rdir.field_0._40_4_);
      auVar169._12_4_ = -(uint)(0.0 <= (float)tray.rdir.field_0._44_4_);
      tray.nearXYZ.field_0.field_0.z.field_0 =
           (vint_impl<4>)blendvps(_DAT_01f79ff0,_DAT_01f79fe0,auVar169);
      auVar55 = maxps(*(undefined1 (*) [16])(ray + 0x30),auVar108);
      auVar108 = maxps(auVar89,auVar108);
      fVar148 = (float)DAT_01f45a30;
      fVar154 = DAT_01f45a30._4_4_;
      fVar158 = DAT_01f45a30._8_4_;
      fVar162 = DAT_01f45a30._12_4_;
      auVar89._8_4_ = auVar183._8_4_;
      auVar89._0_8_ = auVar183._0_8_;
      auVar89._12_4_ = auVar183._12_4_;
      tray.tnear.field_0 =
           (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
           blendvps((undefined1  [16])_DAT_01f45a30,auVar55,auVar89);
      tray.tfar.field_0 =
           (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)blendvps(_DAT_01f45a40,auVar108,auVar89);
      terminated.field_0 = (anon_union_16_2_9473010e_for_vboolf_impl<4>_1)(auVar83 ^ auVar183);
      if (context->user == (RTCRayQueryContext *)0x0) {
        uVar42 = 3;
        pRVar36 = (RTCIntersectArguments *)0x0;
      }
      else {
        pRVar36 = (RTCIntersectArguments *)
                  (CONCAT71((int7)((ulong)context->args >> 8),
                            *(byte *)((long)&context->args->flags + 2)) & 0xffffffffffffff01);
        uVar42 = ((char)pRVar36 == '\0') + 2;
      }
      pNVar46 = stack_node + 2;
      stack_node[0].ptr = 0xfffffffffffffff8;
      stack_near[0].field_0 = _DAT_01f45a30;
      stack_near[1].field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)tray.tnear;
      uVar30 = 0x2223f80;
      pvVar47 = stack_near + 2;
LAB_006dd88f:
      do {
        do {
          root.ptr = pNVar46[-1].ptr;
          if (root.ptr == 0xfffffffffffffff8) goto LAB_006df4a2;
          pNVar46 = pNVar46 + -1;
          pvVar48 = pvVar47 + -1;
          fVar197 = (pvVar48->field_0).v[0];
          fVar95 = pvVar47[-1].field_0.v[1];
          fVar53 = pvVar47[-1].field_0.v[2];
          fVar146 = pvVar47[-1].field_0.v[3];
          auVar56._4_4_ = -(uint)(fVar95 < tray.tfar.field_0.v[1]);
          auVar56._0_4_ = -(uint)(fVar197 < tray.tfar.field_0.v[0]);
          auVar56._8_4_ = -(uint)(fVar53 < tray.tfar.field_0.v[2]);
          auVar56._12_4_ = -(uint)(fVar146 < tray.tfar.field_0.v[3]);
          uVar30 = movmskps(uVar30,auVar56);
          pvVar47 = pvVar48;
        } while (uVar30 == 0);
        uVar50 = (ulong)(byte)uVar30;
        uVar141 = uVar30 & 0xff;
        if (uVar42 < (uint)POPCOUNT(uVar141)) {
LAB_006dd8d6:
          do {
            if ((root.ptr & 8) != 0) {
              if (root.ptr == 0xfffffffffffffff8) goto LAB_006df4a2;
              auVar59._4_4_ = -(uint)(fVar95 < tray.tfar.field_0.v[1]);
              auVar59._0_4_ = -(uint)(fVar197 < tray.tfar.field_0.v[0]);
              auVar59._8_4_ = -(uint)(fVar53 < tray.tfar.field_0.v[2]);
              auVar59._12_4_ = -(uint)(fVar146 < tray.tfar.field_0.v[3]);
              uVar30 = movmskps(uVar30,auVar59);
              pvVar47 = pvVar48;
              if (uVar30 != 0) {
                uVar50 = root.ptr & 0xfffffffffffffff0;
                local_1c48._0_8_ = terminated.field_0._0_8_ ^ 0xffffffffffffffff;
                local_1c48._8_4_ = terminated.field_0.i[2] ^ 0xffffffff;
                local_1c48._12_4_ = terminated.field_0.i[3] ^ 0xffffffff;
                fVar197 = in_XMM14._4_4_;
                fVar95 = in_XMM14._8_4_;
                fVar53 = in_XMM14._12_4_;
                for (lVar35 = 0; lVar35 != (ulong)((uint)root.ptr & 0xf) - 8; lVar35 = lVar35 + 1) {
                  pIVar43 = (Intersectors *)(lVar35 * 0x58);
                  uVar41 = *(ulong *)((long)&(pIVar43->intersector1).intersect + uVar50);
                  auVar60._8_8_ = 0;
                  auVar60._0_8_ = uVar41;
                  uVar4 = *(undefined8 *)((long)&(pIVar43->intersector1).intersect + uVar50 + 4);
                  bVar13 = (byte)uVar41;
                  bVar77 = (byte)uVar4;
                  bVar14 = (byte)(uVar41 >> 8);
                  bVar90 = (byte)((ulong)uVar4 >> 8);
                  bVar15 = (byte)(uVar41 >> 0x10);
                  bVar91 = (byte)((ulong)uVar4 >> 0x10);
                  bVar16 = (byte)(uVar41 >> 0x18);
                  bVar92 = (byte)((ulong)uVar4 >> 0x18);
                  bVar17 = (byte)(uVar41 >> 0x20);
                  bVar93 = (byte)((ulong)uVar4 >> 0x20);
                  bVar18 = (byte)(uVar41 >> 0x28);
                  bVar96 = (byte)((ulong)uVar4 >> 0x28);
                  bVar19 = (byte)(uVar41 >> 0x30);
                  bVar97 = (byte)((ulong)uVar4 >> 0x30);
                  bVar22 = (byte)((ulong)uVar4 >> 0x38);
                  bVar20 = (byte)(uVar41 >> 0x38);
                  auVar82[0] = -((byte)((bVar13 < bVar77) * bVar13 | (bVar13 >= bVar77) * bVar77) ==
                                bVar13);
                  auVar82[1] = -((byte)((bVar14 < bVar90) * bVar14 | (bVar14 >= bVar90) * bVar90) ==
                                bVar14);
                  auVar82[2] = -((byte)((bVar15 < bVar91) * bVar15 | (bVar15 >= bVar91) * bVar91) ==
                                bVar15);
                  auVar82[3] = -((byte)((bVar16 < bVar92) * bVar16 | (bVar16 >= bVar92) * bVar92) ==
                                bVar16);
                  auVar82[4] = -((byte)((bVar17 < bVar93) * bVar17 | (bVar17 >= bVar93) * bVar93) ==
                                bVar17);
                  auVar82[5] = -((byte)((bVar18 < bVar96) * bVar18 | (bVar18 >= bVar96) * bVar96) ==
                                bVar18);
                  auVar82[6] = -((byte)((bVar19 < bVar97) * bVar19 | (bVar19 >= bVar97) * bVar97) ==
                                bVar19);
                  auVar82[7] = -((byte)((bVar20 < bVar22) * bVar20 | (bVar20 >= bVar22) * bVar22) ==
                                bVar20);
                  auVar82[8] = 0xff;
                  auVar82[9] = 0xff;
                  auVar82[10] = 0xff;
                  auVar82[0xb] = 0xff;
                  auVar82[0xc] = 0xff;
                  auVar82[0xd] = 0xff;
                  auVar82[0xe] = 0xff;
                  auVar82[0xf] = 0xff;
                  auVar101._8_4_ = 0xffffffff;
                  auVar101._0_8_ = 0xffffffffffffffff;
                  auVar101._12_4_ = 0xffffffff;
                  auVar89 = pmovzxbd(auVar60,auVar82 ^ auVar101);
                  auVar89 = auVar89 ^ auVar101;
                  auVar61._0_4_ = auVar89._0_4_ << 0x1f;
                  auVar61._4_4_ = auVar89._4_4_ << 0x1f;
                  auVar61._8_4_ = auVar89._8_4_ << 0x1f;
                  auVar61._12_4_ = auVar89._12_4_ << 0x1f;
                  uVar30 = movmskps((int)lVar35,auVar61);
                  if (uVar30 != 0) {
                    pIVar43 = (Intersectors *)((long)&pIVar43->ptr + uVar50);
                    uVar41 = (ulong)(uVar30 & 0xff);
                    do {
                      lVar39 = 0;
                      if (uVar41 != 0) {
                        for (; (uVar41 >> lVar39 & 1) == 0; lVar39 = lVar39 + 1) {
                        }
                      }
                      auVar62._8_8_ = 0;
                      auVar62._0_8_ = (pIVar43->intersector1).intersect;
                      auVar89 = pmovzxbd(auVar62,auVar62);
                      fVar146 = *(float *)&(pIVar43->intersector1).name;
                      fVar163 = *(float *)((long)&(pIVar43->intersector4).intersect + 4);
                      lower_x.field_0.v[1] = (float)auVar89._4_4_ * fVar163 + fVar146;
                      lower_x.field_0.v[0] = (float)auVar89._0_4_ * fVar163 + fVar146;
                      lower_x.field_0.v[2] = (float)auVar89._8_4_ * fVar163 + fVar146;
                      lower_x.field_0.v[3] = (float)auVar89._12_4_ * fVar163 + fVar146;
                      auVar63._8_8_ = 0;
                      auVar63._0_8_ = *(ulong *)((long)&(pIVar43->intersector1).intersect + 4);
                      auVar89 = pmovzxbd(auVar63,auVar63);
                      upper_x.field_0.v[1] = (float)auVar89._4_4_ * fVar163 + fVar146;
                      upper_x.field_0.v[0] = (float)auVar89._0_4_ * fVar163 + fVar146;
                      upper_x.field_0.v[3] = (float)auVar89._12_4_ * fVar163 + fVar146;
                      upper_x.field_0.v[2] = (float)auVar89._8_4_ * fVar163 + fVar146;
                      auVar64._8_8_ = 0;
                      auVar64._0_8_ = (pIVar43->intersector1).occluded;
                      auVar89 = pmovzxbd(auVar64,auVar64);
                      fVar146 = *(float *)((long)&(pIVar43->intersector1).name + 4);
                      fVar163 = *(float *)&(pIVar43->intersector4).occluded;
                      lower_y.field_0.v[1] = (float)auVar89._4_4_ * fVar163 + fVar146;
                      lower_y.field_0.v[0] = (float)auVar89._0_4_ * fVar163 + fVar146;
                      lower_y.field_0.v[3] = (float)auVar89._12_4_ * fVar163 + fVar146;
                      lower_y.field_0.v[2] = (float)auVar89._8_4_ * fVar163 + fVar146;
                      auVar65._8_8_ = 0;
                      auVar65._0_8_ = *(ulong *)((long)&(pIVar43->intersector1).occluded + 4);
                      auVar89 = pmovzxbd(auVar65,auVar65);
                      upper_y.field_0.v[0] = (float)auVar89._0_4_ * fVar163 + fVar146;
                      upper_y.field_0.v[1] = (float)auVar89._4_4_ * fVar163 + fVar146;
                      upper_y.field_0.v[2] = (float)auVar89._8_4_ * fVar163 + fVar146;
                      upper_y.field_0.v[3] = (float)auVar89._12_4_ * fVar163 + fVar146;
                      auVar66._8_8_ = 0;
                      auVar66._0_8_ = (pIVar43->intersector1).pointQuery;
                      auVar89 = pmovzxbd(auVar66,auVar66);
                      fVar146 = *(float *)&(pIVar43->intersector4).intersect;
                      fVar163 = *(float *)((long)&(pIVar43->intersector4).occluded + 4);
                      lower_z.field_0.v[1] = (float)auVar89._4_4_ * fVar163 + fVar146;
                      lower_z.field_0.v[0] = (float)auVar89._0_4_ * fVar163 + fVar146;
                      lower_z.field_0.v[2] = (float)auVar89._8_4_ * fVar163 + fVar146;
                      lower_z.field_0.v[3] = (float)auVar89._12_4_ * fVar163 + fVar146;
                      auVar67._8_8_ = 0;
                      auVar67._0_8_ = *(ulong *)((long)&(pIVar43->intersector1).pointQuery + 4);
                      auVar89 = pmovzxbd(auVar67,auVar67);
                      upper_z.field_0.v[0] = (float)auVar89._0_4_ * fVar163 + fVar146;
                      upper_z.field_0.v[1] = (float)auVar89._4_4_ * fVar163 + fVar146;
                      upper_z.field_0.v[2] = (float)auVar89._8_4_ * fVar163 + fVar146;
                      upper_z.field_0.v[3] = (float)auVar89._12_4_ * fVar163 + fVar146;
                      fVar146 = lower_x.field_0.v[lVar39];
                      fVar163 = (fVar146 - (float)tray.org.field_0._0_4_) *
                                (float)tray.rdir.field_0._0_4_;
                      fVar52 = (fVar146 - (float)tray.org.field_0._4_4_) *
                               (float)tray.rdir.field_0._4_4_;
                      fVar74 = (fVar146 - (float)tray.org.field_0._8_4_) *
                               (float)tray.rdir.field_0._8_4_;
                      fVar76 = (fVar146 - (float)tray.org.field_0._12_4_) *
                               (float)tray.rdir.field_0._12_4_;
                      fVar146 = lower_y.field_0.v[lVar39];
                      fVar75 = (fVar146 - (float)tray.org.field_0._16_4_) *
                               (float)tray.rdir.field_0._16_4_;
                      fVar78 = (fVar146 - (float)tray.org.field_0._20_4_) *
                               (float)tray.rdir.field_0._20_4_;
                      fVar94 = (fVar146 - (float)tray.org.field_0._24_4_) *
                               (float)tray.rdir.field_0._24_4_;
                      fVar98 = (fVar146 - (float)tray.org.field_0._28_4_) *
                               (float)tray.rdir.field_0._28_4_;
                      fVar146 = lower_z.field_0.v[lVar39];
                      fVar99 = (fVar146 - (float)tray.org.field_0._32_4_) *
                               (float)tray.rdir.field_0._32_4_;
                      fVar100 = (fVar146 - (float)tray.org.field_0._36_4_) *
                                (float)tray.rdir.field_0._36_4_;
                      fVar104 = (fVar146 - (float)tray.org.field_0._40_4_) *
                                (float)tray.rdir.field_0._40_4_;
                      fVar105 = (fVar146 - (float)tray.org.field_0._44_4_) *
                                (float)tray.rdir.field_0._44_4_;
                      fVar146 = upper_x.field_0.v[lVar39];
                      fVar106 = (fVar146 - (float)tray.org.field_0._0_4_) *
                                (float)tray.rdir.field_0._0_4_;
                      fVar107 = (fVar146 - (float)tray.org.field_0._4_4_) *
                                (float)tray.rdir.field_0._4_4_;
                      fVar113 = (fVar146 - (float)tray.org.field_0._8_4_) *
                                (float)tray.rdir.field_0._8_4_;
                      fVar116 = (fVar146 - (float)tray.org.field_0._12_4_) *
                                (float)tray.rdir.field_0._12_4_;
                      fVar146 = upper_y.field_0.v[lVar39];
                      fVar132 = (fVar146 - (float)tray.org.field_0._16_4_) *
                                (float)tray.rdir.field_0._16_4_;
                      fVar133 = (fVar146 - (float)tray.org.field_0._20_4_) *
                                (float)tray.rdir.field_0._20_4_;
                      fVar149 = (fVar146 - (float)tray.org.field_0._24_4_) *
                                (float)tray.rdir.field_0._24_4_;
                      fVar155 = (fVar146 - (float)tray.org.field_0._28_4_) *
                                (float)tray.rdir.field_0._28_4_;
                      fVar146 = upper_z.field_0.v[lVar39];
                      fVar118 = (fVar146 - (float)tray.org.field_0._32_4_) *
                                (float)tray.rdir.field_0._32_4_;
                      fVar119 = (fVar146 - (float)tray.org.field_0._36_4_) *
                                (float)tray.rdir.field_0._36_4_;
                      fVar131 = (fVar146 - (float)tray.org.field_0._40_4_) *
                                (float)tray.rdir.field_0._40_4_;
                      fVar146 = (fVar146 - (float)tray.org.field_0._44_4_) *
                                (float)tray.rdir.field_0._44_4_;
                      uVar30 = (uint)((int)fVar106 < (int)fVar163) * (int)fVar106 |
                               (uint)((int)fVar106 >= (int)fVar163) * (int)fVar163;
                      uVar141 = (uint)((int)fVar107 < (int)fVar52) * (int)fVar107 |
                                (uint)((int)fVar107 >= (int)fVar52) * (int)fVar52;
                      uVar143 = (uint)((int)fVar113 < (int)fVar74) * (int)fVar113 |
                                (uint)((int)fVar113 >= (int)fVar74) * (int)fVar74;
                      uVar145 = (uint)((int)fVar116 < (int)fVar76) * (int)fVar116 |
                                (uint)((int)fVar116 >= (int)fVar76) * (int)fVar76;
                      uVar166 = (uint)((int)fVar132 < (int)fVar75) * (int)fVar132 |
                                (uint)((int)fVar132 >= (int)fVar75) * (int)fVar75;
                      uVar173 = (uint)((int)fVar133 < (int)fVar78) * (int)fVar133 |
                                (uint)((int)fVar133 >= (int)fVar78) * (int)fVar78;
                      uVar176 = (uint)((int)fVar149 < (int)fVar94) * (int)fVar149 |
                                (uint)((int)fVar149 >= (int)fVar94) * (int)fVar94;
                      uVar179 = (uint)((int)fVar155 < (int)fVar98) * (int)fVar155 |
                                (uint)((int)fVar155 >= (int)fVar98) * (int)fVar98;
                      uVar166 = ((int)uVar166 < (int)uVar30) * uVar30 |
                                ((int)uVar166 >= (int)uVar30) * uVar166;
                      uVar173 = ((int)uVar173 < (int)uVar141) * uVar141 |
                                ((int)uVar173 >= (int)uVar141) * uVar173;
                      uVar176 = ((int)uVar176 < (int)uVar143) * uVar143 |
                                ((int)uVar176 >= (int)uVar143) * uVar176;
                      uVar179 = ((int)uVar179 < (int)uVar145) * uVar145 |
                                ((int)uVar179 >= (int)uVar145) * uVar179;
                      uVar30 = (uint)((int)fVar118 < (int)fVar99) * (int)fVar118 |
                               (uint)((int)fVar118 >= (int)fVar99) * (int)fVar99;
                      uVar141 = (uint)((int)fVar119 < (int)fVar100) * (int)fVar119 |
                                (uint)((int)fVar119 >= (int)fVar100) * (int)fVar100;
                      uVar143 = (uint)((int)fVar131 < (int)fVar104) * (int)fVar131 |
                                (uint)((int)fVar131 >= (int)fVar104) * (int)fVar104;
                      uVar145 = (uint)((int)fVar146 < (int)fVar105) * (int)fVar146 |
                                (uint)((int)fVar146 >= (int)fVar105) * (int)fVar105;
                      uVar30 = ((int)uVar30 < (int)uVar166) * uVar166 |
                               ((int)uVar30 >= (int)uVar166) * uVar30;
                      uVar141 = ((int)uVar141 < (int)uVar173) * uVar173 |
                                ((int)uVar141 >= (int)uVar173) * uVar141;
                      uVar143 = ((int)uVar143 < (int)uVar176) * uVar176 |
                                ((int)uVar143 >= (int)uVar176) * uVar143;
                      uVar145 = ((int)uVar145 < (int)uVar179) * uVar179 |
                                ((int)uVar145 >= (int)uVar179) * uVar145;
                      uVar166 = (uint)((int)fVar106 < (int)fVar163) * (int)fVar163 |
                                (uint)((int)fVar106 >= (int)fVar163) * (int)fVar106;
                      uVar173 = (uint)((int)fVar107 < (int)fVar52) * (int)fVar52 |
                                (uint)((int)fVar107 >= (int)fVar52) * (int)fVar107;
                      uVar176 = (uint)((int)fVar113 < (int)fVar74) * (int)fVar74 |
                                (uint)((int)fVar113 >= (int)fVar74) * (int)fVar113;
                      uVar179 = (uint)((int)fVar116 < (int)fVar76) * (int)fVar76 |
                                (uint)((int)fVar116 >= (int)fVar76) * (int)fVar116;
                      uVar150 = (uint)((int)fVar132 < (int)fVar75) * (int)fVar75 |
                                (uint)((int)fVar132 >= (int)fVar75) * (int)fVar132;
                      uVar156 = (uint)((int)fVar133 < (int)fVar78) * (int)fVar78 |
                                (uint)((int)fVar133 >= (int)fVar78) * (int)fVar133;
                      uVar160 = (uint)((int)fVar149 < (int)fVar94) * (int)fVar94 |
                                (uint)((int)fVar149 >= (int)fVar94) * (int)fVar149;
                      uVar164 = (uint)((int)fVar155 < (int)fVar98) * (int)fVar98 |
                                (uint)((int)fVar155 >= (int)fVar98) * (int)fVar155;
                      uVar150 = ((int)uVar166 < (int)uVar150) * uVar166 |
                                ((int)uVar166 >= (int)uVar150) * uVar150;
                      uVar156 = ((int)uVar173 < (int)uVar156) * uVar173 |
                                ((int)uVar173 >= (int)uVar156) * uVar156;
                      uVar160 = ((int)uVar176 < (int)uVar160) * uVar176 |
                                ((int)uVar176 >= (int)uVar160) * uVar160;
                      uVar164 = ((int)uVar179 < (int)uVar164) * uVar179 |
                                ((int)uVar179 >= (int)uVar164) * uVar164;
                      uVar166 = (uint)((int)fVar118 < (int)fVar99) * (int)fVar99 |
                                (uint)((int)fVar118 >= (int)fVar99) * (int)fVar118;
                      uVar173 = (uint)((int)fVar119 < (int)fVar100) * (int)fVar100 |
                                (uint)((int)fVar119 >= (int)fVar100) * (int)fVar119;
                      uVar176 = (uint)((int)fVar131 < (int)fVar104) * (int)fVar104 |
                                (uint)((int)fVar131 >= (int)fVar104) * (int)fVar131;
                      uVar179 = (uint)((int)fVar146 < (int)fVar105) * (int)fVar105 |
                                (uint)((int)fVar146 >= (int)fVar105) * (int)fVar146;
                      uVar166 = ((int)uVar150 < (int)uVar166) * uVar150 |
                                ((int)uVar150 >= (int)uVar166) * uVar166;
                      uVar173 = ((int)uVar156 < (int)uVar173) * uVar156 |
                                ((int)uVar156 >= (int)uVar173) * uVar173;
                      uVar176 = ((int)uVar160 < (int)uVar176) * uVar160 |
                                ((int)uVar160 >= (int)uVar176) * uVar176;
                      uVar179 = ((int)uVar164 < (int)uVar179) * uVar164 |
                                ((int)uVar164 >= (int)uVar179) * uVar179;
                      uVar150 = local_1c48._0_4_;
                      auVar109._0_4_ =
                           -(uint)((float)((uint)((int)uVar30 < tray.tnear.field_0.i[0]) *
                                           tray.tnear.field_0.i[0] |
                                          ((int)uVar30 >= tray.tnear.field_0.i[0]) * uVar30) <=
                                  (float)((uint)(tray.tfar.field_0.i[0] < (int)uVar166) *
                                          tray.tfar.field_0.i[0] |
                                         (tray.tfar.field_0.i[0] >= (int)uVar166) * uVar166)) &
                           uVar150;
                      uVar166 = local_1c48._4_4_;
                      auVar109._4_4_ =
                           -(uint)((float)((uint)((int)uVar141 < tray.tnear.field_0.i[1]) *
                                           tray.tnear.field_0.i[1] |
                                          ((int)uVar141 >= tray.tnear.field_0.i[1]) * uVar141) <=
                                  (float)((uint)(tray.tfar.field_0.i[1] < (int)uVar173) *
                                          tray.tfar.field_0.i[1] |
                                         (tray.tfar.field_0.i[1] >= (int)uVar173) * uVar173)) &
                           uVar166;
                      uVar141 = local_1c48._8_4_;
                      auVar109._8_4_ =
                           -(uint)((float)((uint)((int)uVar143 < tray.tnear.field_0.i[2]) *
                                           tray.tnear.field_0.i[2] |
                                          ((int)uVar143 >= tray.tnear.field_0.i[2]) * uVar143) <=
                                  (float)((uint)(tray.tfar.field_0.i[2] < (int)uVar176) *
                                          tray.tfar.field_0.i[2] |
                                         (tray.tfar.field_0.i[2] >= (int)uVar176) * uVar176)) &
                           uVar141;
                      uVar143 = local_1c48._12_4_;
                      auVar109._12_4_ =
                           -(uint)((float)((uint)((int)uVar145 < tray.tnear.field_0.i[3]) *
                                           tray.tnear.field_0.i[3] |
                                          ((int)uVar145 >= tray.tnear.field_0.i[3]) * uVar145) <=
                                  (float)((uint)(tray.tfar.field_0.i[3] < (int)uVar179) *
                                          tray.tfar.field_0.i[3] |
                                         (tray.tfar.field_0.i[3] >= (int)uVar179) * uVar179)) &
                           uVar143;
                      uVar30 = movmskps((int)pRVar36,auVar109);
                      pRVar36 = (RTCIntersectArguments *)(ulong)uVar30;
                      if (uVar30 == 0) {
                        bVar51 = false;
                      }
                      else {
                        uVar5 = *(ushort *)((long)&pIVar43->ptr + lVar39 * 8 + 2);
                        uVar30 = *(uint *)&(pIVar43->intersector4).name;
                        uVar145 = *(uint *)((long)&pIVar43->ptr + lVar39 * 8 + 4);
                        pGVar6 = (context->scene->geometries).items[uVar30].ptr;
                        lVar7 = *(long *)&pGVar6->field_0x58;
                        lVar8 = *(long *)&pGVar6[1].time_range.upper;
                        pRVar37 = (RTCIntersectArguments *)
                                  ((ulong)uVar145 *
                                  pGVar6[1].super_RefCount.refCounter.
                                  super___atomic_base<unsigned_long>._M_i);
                        uVar176 = *(ushort *)(&pIVar43->ptr + lVar39) & 0x7fff;
                        uVar179 = uVar5 & 0x7fff;
                        uVar173 = *(uint *)((long)&pRVar37->feature_mask + lVar7);
                        uVar33 = (ulong)uVar173;
                        uVar49 = (ulong)(uVar173 * uVar179 +
                                        *(int *)((long)&pRVar37->flags + lVar7) + uVar176);
                        p_Var9 = pGVar6[1].intersectionFilterN;
                        puVar2 = (undefined8 *)(lVar8 + (uVar49 + 1) * (long)p_Var9);
                        lVar1 = uVar49 + uVar33;
                        lVar45 = uVar49 + uVar33 + 1;
                        local_17a8 = *(undefined1 (*) [16])(lVar8 + lVar1 * (long)p_Var9);
                        puVar3 = (undefined8 *)(lVar8 + lVar45 * (long)p_Var9);
                        local_1768 = *puVar3;
                        uStack_1760 = puVar3[1];
                        uVar38 = (ulong)(-1 < (short)*(ushort *)(&pIVar43->ptr + lVar39));
                        lVar39 = uVar38 + lVar45;
                        puVar3 = (undefined8 *)(lVar8 + lVar39 * (long)p_Var9);
                        local_1778 = *puVar3;
                        uStack_1770 = puVar3[1];
                        if ((short)uVar5 < 0) {
                          uVar33 = 0;
                        }
                        local_1738 = *(undefined1 (*) [16])
                                      (lVar8 + (lVar45 + uVar33) * (long)p_Var9);
                        puVar3 = (undefined8 *)(lVar8 + (uVar33 + lVar39) * (long)p_Var9);
                        lower_x.field_0 =
                             *(anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)
                              (lVar8 + (long)p_Var9 * uVar49);
                        local_1798 = (RTCFilterFunctionN)*puVar2;
                        p_Stack_1790 = (RTCIntersectFunctionN)puVar2[1];
                        local_1788 = *(undefined1 (*) [16])
                                      (lVar8 + (uVar49 + uVar38 + 1) * (long)p_Var9);
                        local_1758 = local_17a8;
                        local_1748 = local_1768;
                        uStack_1740 = uStack_1760;
                        local_1728 = *(undefined1 (*) [16])(lVar8 + (lVar1 + uVar33) * (long)p_Var9)
                        ;
                        local_1718 = local_1768;
                        uStack_1710 = uStack_1760;
                        local_1708 = local_1778;
                        uStack_1700 = uStack_1770;
                        local_16f8 = *puVar3;
                        uStack_16f0 = puVar3[1];
                        local_16e8 = local_1738;
                        pRVar34 = (RTCIntersectArguments *)local_17a8;
                        uVar33 = 0;
                        pRVar36 = pRVar37;
                        local_1a98 = pRVar34;
                        do {
                          uVar31 = SUB84(pRVar34,0);
                          if (uVar33 == 4) {
                            auVar128._4_4_ = in_XMM13_Db;
                            auVar128._0_4_ = in_XMM13_Da;
                            auVar128._8_4_ = in_XMM13_Dc;
                            auVar128._12_4_ = in_XMM13_Dd;
                            auVar89 = local_1c48;
                            goto LAB_006df323;
                          }
                          local_1c28._4_4_ = in_XMM13_Db;
                          local_1c28._0_4_ = in_XMM13_Da;
                          local_1c28._8_4_ = in_XMM13_Dc;
                          local_1c28._12_4_ = in_XMM13_Dd;
                          auVar23._4_4_ = fVar95;
                          auVar23._0_4_ = fVar197;
                          auVar23._8_4_ = fVar53;
                          fVar148 = *(float *)&local_1a98[-2].filter;
                          fVar154 = *(float *)((long)&local_1a98[-2].filter + 4);
                          fVar158 = *(float *)&local_1a98[-2].intersect;
                          fVar162 = (float)local_1a98[-1].feature_mask;
                          fVar197 = *(float *)&local_1a98[-1].context;
                          fVar146 = (float)local_1a98->feature_mask;
                          fVar163 = *(float *)&local_1a98->context;
                          fVar187 = fVar154 - fVar162;
                          fVar191 = fVar154 - fVar162;
                          fVar193 = fVar154 - fVar162;
                          fVar195 = fVar154 - fVar162;
                          fVar134 = fVar158 - fVar197;
                          fVar142 = fVar158 - fVar197;
                          fVar144 = fVar158 - fVar197;
                          fVar147 = fVar158 - fVar197;
                          fVar151 = fVar146 - fVar154;
                          fVar157 = fVar146 - fVar154;
                          fVar161 = fVar146 - fVar154;
                          fVar165 = fVar146 - fVar154;
                          fVar199 = fVar163 - fVar158;
                          fVar200 = fVar163 - fVar158;
                          fVar201 = fVar163 - fVar158;
                          fVar202 = fVar163 - fVar158;
                          fVar131 = fVar134 * fVar151 - fVar187 * fVar199;
                          fVar132 = fVar142 * fVar157 - fVar191 * fVar200;
                          fVar133 = fVar144 * fVar161 - fVar193 * fVar201;
                          fVar149 = fVar147 * fVar165 - fVar195 * fVar202;
                          fVar198 = (float)local_1a98->flags - fVar148;
                          fVar120 = fVar148 - (float)local_1a98[-1].flags;
                          fVar155 = fVar120 * fVar199 - fVar134 * fVar198;
                          fVar116 = fVar120 * fVar200 - fVar142 * fVar198;
                          fVar118 = fVar120 * fVar201 - fVar144 * fVar198;
                          fVar119 = fVar120 * fVar202 - fVar147 * fVar198;
                          local_1c18 = fVar187 * fVar198 - fVar120 * fVar151;
                          fVar192 = fVar191 * fVar198 - fVar120 * fVar157;
                          fVar194 = fVar193 * fVar198 - fVar120 * fVar161;
                          fVar196 = fVar195 * fVar198 - fVar120 * fVar165;
                          local_1968 = CONCAT44(uVar30,uVar30);
                          uStack_1960 = CONCAT44(uVar30,uVar30);
                          local_1978 = CONCAT44(uVar145,uVar145);
                          uStack_1970 = CONCAT44(uVar145,uVar145);
                          fVar52 = *(float *)(ray + 0x10);
                          fVar74 = *(float *)(ray + 0x14);
                          fVar76 = *(float *)(ray + 0x18);
                          fVar95 = *(float *)(ray + 0x1c);
                          fVar159 = fVar154 - fVar52;
                          fVar114 = fVar154 - fVar74;
                          fVar117 = fVar154 - fVar76;
                          fVar154 = fVar154 - fVar95;
                          auVar89 = *(undefined1 (*) [16])(ray + 0x20);
                          fVar182 = fVar158 - *(float *)(ray + 0x20);
                          fVar185 = fVar158 - *(float *)(ray + 0x24);
                          fVar186 = fVar158 - *(float *)(ray + 0x28);
                          fVar158 = fVar158 - *(float *)(ray + 0x2c);
                          fVar53 = *(float *)(ray + 0x50);
                          fVar75 = *(float *)(ray + 0x54);
                          local_1bd8 = *(undefined8 *)(ray + 0x50);
                          fVar78 = *(float *)(ray + 0x58);
                          fVar94 = *(float *)(ray + 0x5c);
                          uStack_1bd0 = *(undefined8 *)(ray + 0x58);
                          fVar98 = *(float *)(ray + 0x60);
                          fVar99 = *(float *)(ray + 100);
                          local_1be8 = *(undefined8 *)(ray + 0x60);
                          fVar100 = *(float *)(ray + 0x68);
                          fVar104 = *(float *)(ray + 0x6c);
                          uStack_1be0 = *(undefined8 *)(ray + 0x68);
                          fVar203 = fVar159 * fVar98 - fVar182 * fVar53;
                          fVar206 = fVar114 * fVar99 - fVar185 * fVar75;
                          fVar207 = fVar117 * fVar100 - fVar186 * fVar78;
                          fVar208 = fVar154 * fVar104 - fVar158 * fVar94;
                          auVar83 = *(undefined1 (*) [16])ray;
                          fVar167 = fVar148 - *(float *)ray;
                          fVar174 = fVar148 - *(float *)(ray + 4);
                          fVar177 = fVar148 - *(float *)(ray + 8);
                          fVar148 = fVar148 - *(float *)(ray + 0xc);
                          fVar105 = *(float *)(ray + 0x40);
                          fVar106 = *(float *)(ray + 0x44);
                          local_1bc8 = *(undefined8 *)(ray + 0x40);
                          fVar107 = *(float *)(ray + 0x48);
                          fVar113 = *(float *)(ray + 0x4c);
                          uStack_1bc0 = *(undefined8 *)(ray + 0x48);
                          fVar209 = fVar182 * fVar105 - fVar167 * fVar98;
                          fVar212 = fVar185 * fVar106 - fVar174 * fVar99;
                          fVar213 = fVar186 * fVar107 - fVar177 * fVar100;
                          fVar214 = fVar158 * fVar113 - fVar148 * fVar104;
                          fVar168 = fVar167 * fVar53 - fVar159 * fVar105;
                          fVar175 = fVar174 * fVar75 - fVar114 * fVar106;
                          fVar178 = fVar177 * fVar78 - fVar117 * fVar107;
                          fVar180 = fVar148 * fVar94 - fVar154 * fVar113;
                          fVar53 = fVar131 * fVar105 + fVar155 * fVar53 + local_1c18 * fVar98;
                          fVar98 = fVar132 * fVar106 + fVar116 * fVar75 + fVar192 * fVar99;
                          fVar99 = fVar133 * fVar107 + fVar118 * fVar78 + fVar194 * fVar100;
                          fVar100 = fVar149 * fVar113 + fVar119 * fVar94 + fVar196 * fVar104;
                          uVar173 = (uint)fVar53 & 0x80000000;
                          uVar156 = (uint)fVar98 & 0x80000000;
                          uVar160 = (uint)fVar99 & 0x80000000;
                          uVar164 = (uint)fVar100 & 0x80000000;
                          fVar104 = (float)((uint)(fVar198 * fVar203 +
                                                  fVar151 * fVar209 + fVar199 * fVar168) ^ uVar173);
                          fVar105 = (float)((uint)(fVar198 * fVar206 +
                                                  fVar157 * fVar212 + fVar200 * fVar175) ^ uVar156);
                          fVar106 = (float)((uint)(fVar198 * fVar207 +
                                                  fVar161 * fVar213 + fVar201 * fVar178) ^ uVar160);
                          fVar107 = (float)((uint)(fVar198 * fVar208 +
                                                  fVar165 * fVar214 + fVar202 * fVar180) ^ uVar164);
                          auVar152._0_4_ = -(uint)(0.0 <= fVar104) & local_1c48._0_4_;
                          auVar152._4_4_ = -(uint)(0.0 <= fVar105) & local_1c48._4_4_;
                          auVar152._8_4_ = -(uint)(0.0 <= fVar106) & local_1c48._8_4_;
                          auVar152._12_4_ = -(uint)(0.0 <= fVar107) & local_1c48._12_4_;
                          iVar32 = movmskps(uVar31,auVar152);
                          fVar75 = *(float *)&local_1a98[-1].filter;
                          fVar78 = *(float *)((long)&local_1a98[-1].filter + 4);
                          fVar94 = *(float *)&local_1a98[-1].intersect;
                          local_1b88 = SUB124(*(undefined1 (*) [12])local_1a98,0);
                          if (iVar32 == 0) {
LAB_006de17b:
                            iVar32 = 0;
                            auVar72._8_8_ = uVar29;
                            auVar72._0_8_ = uVar28;
                            auVar88 = _local_1bf8;
                            auVar189 = in_XMM15;
                            fVar116 = (float)local_1ba8._4_4_;
                            fVar118 = fStack_1ba0;
                            fVar119 = fStack_1b9c;
                            auVar211 = local_1c28;
                            fVar131 = (float)local_1b98._0_4_;
                            fVar132 = (float)local_1b98._4_4_;
                            fVar133 = (float)uStack_1b90;
                            fVar149 = uStack_1b90._4_4_;
                            _auStack_1c14 = auVar23;
                          }
                          else {
                            auStack_1c14._0_4_ = fVar192;
                            auStack_1c14._4_4_ = fVar194;
                            fStack_1c0c = fVar196;
                            fVar113 = (float)((uint)(fVar120 * fVar203 +
                                                    fVar187 * fVar209 + fVar134 * fVar168) ^ uVar173
                                             );
                            fVar134 = (float)((uint)(fVar120 * fVar206 +
                                                    fVar191 * fVar212 + fVar142 * fVar175) ^ uVar156
                                             );
                            auVar189._4_4_ = fVar134;
                            auVar189._0_4_ = fVar113;
                            fVar142 = (float)((uint)(fVar120 * fVar207 +
                                                    fVar193 * fVar213 + fVar144 * fVar178) ^ uVar160
                                             );
                            fVar120 = (float)((uint)(fVar120 * fVar208 +
                                                    fVar195 * fVar214 + fVar147 * fVar180) ^ uVar164
                                             );
                            auVar188._0_4_ = -(uint)(0.0 <= fVar113) & auVar152._0_4_;
                            auVar188._4_4_ = -(uint)(0.0 <= fVar134) & auVar152._4_4_;
                            auVar188._8_4_ = -(uint)(0.0 <= fVar142) & auVar152._8_4_;
                            auVar188._12_4_ = -(uint)(0.0 <= fVar120) & auVar152._12_4_;
                            iVar32 = movmskps(iVar32,auVar188);
                            if (iVar32 != 0) {
                              auVar211._4_4_ = fVar105;
                              auVar211._0_4_ = fVar104;
                              fVar144 = ABS(fVar53);
                              fVar147 = ABS(fVar98);
                              fVar151 = ABS(fVar99);
                              fVar157 = ABS(fVar100);
                              auVar172._0_4_ =
                                   -(uint)(fVar113 <= fVar144 - fVar104) & auVar188._0_4_;
                              auVar172._4_4_ =
                                   -(uint)(fVar134 <= fVar147 - fVar105) & auVar188._4_4_;
                              auVar172._8_4_ =
                                   -(uint)(fVar142 <= fVar151 - fVar106) & auVar188._8_4_;
                              auVar172._12_4_ =
                                   -(uint)(fVar120 <= fVar157 - fVar107) & auVar188._12_4_;
                              iVar32 = movmskps(iVar32,auVar172);
                              if (iVar32 != 0) {
                                auVar189._8_4_ = fVar142;
                                auVar189._12_4_ = fVar120;
                                fVar104 = (float)(uVar173 ^
                                                 (uint)(fVar167 * fVar131 +
                                                       fVar159 * fVar155 + fVar182 * local_1c18));
                                fVar105 = (float)(uVar156 ^
                                                 (uint)(fVar174 * fVar132 +
                                                       fVar114 * fVar116 + fVar185 * fVar192));
                                fVar113 = (float)(uVar160 ^
                                                 (uint)(fVar177 * fVar133 +
                                                       fVar117 * fVar118 + fVar186 * fVar194));
                                fVar148 = (float)(uVar164 ^
                                                 (uint)(fVar148 * fVar149 +
                                                       fVar154 * fVar119 + fVar158 * fVar196));
                                auVar130._0_4_ =
                                     -(uint)(*(float *)(ray + 0x30) * fVar144 < fVar104 &&
                                            fVar104 <= *(float *)(ray + 0x80) * fVar144) &
                                     auVar172._0_4_;
                                auVar130._4_4_ =
                                     -(uint)(*(float *)(ray + 0x34) * fVar147 < fVar105 &&
                                            fVar105 <= *(float *)(ray + 0x84) * fVar147) &
                                     auVar172._4_4_;
                                auVar130._8_4_ =
                                     -(uint)(*(float *)(ray + 0x38) * fVar151 < fVar113 &&
                                            fVar113 <= *(float *)(ray + 0x88) * fVar151) &
                                     auVar172._8_4_;
                                auVar130._12_4_ =
                                     -(uint)(*(float *)(ray + 0x3c) * fVar157 < fVar148 &&
                                            fVar148 <= *(float *)(ray + 0x8c) * fVar157) &
                                     auVar172._12_4_;
                                iVar32 = movmskps(iVar32,auVar130);
                                if (iVar32 != 0) {
                                  auVar72._0_4_ = -(uint)(fVar53 != 0.0) & auVar130._0_4_;
                                  auVar72._4_4_ = -(uint)(fVar98 != 0.0) & auVar130._4_4_;
                                  auVar72._8_4_ = -(uint)(fVar99 != 0.0) & auVar130._8_4_;
                                  auVar72._12_4_ = -(uint)(fVar100 != 0.0) & auVar130._12_4_;
                                  iVar32 = movmskps(iVar32,auVar72);
                                  auVar211._8_4_ = fVar106;
                                  auVar211._12_4_ = fVar107;
                                  auVar88._8_4_ = fVar151;
                                  auVar88._0_8_ = CONCAT44(fVar98,fVar53) & 0x7fffffff7fffffff;
                                  auVar88._12_4_ = fVar157;
                                  if (iVar32 == 0) goto LAB_006ded2d;
                                  goto LAB_006de183;
                                }
                              }
                              goto LAB_006de17b;
                            }
LAB_006ded2d:
                            auVar72._8_8_ = uVar29;
                            auVar72._0_8_ = uVar28;
                            auVar88 = _local_1bf8;
                            auVar189 = in_XMM15;
                            fVar116 = (float)local_1ba8._4_4_;
                            fVar118 = fStack_1ba0;
                            fVar119 = fStack_1b9c;
                            auVar211 = local_1c28;
                            fVar131 = (float)local_1b98._0_4_;
                            fVar132 = (float)local_1b98._4_4_;
                            fVar133 = (float)uStack_1b90;
                            fVar149 = uStack_1b90._4_4_;
                            _auStack_1c14 = auVar23;
                          }
LAB_006de183:
                          local_1c08._0_4_ = SUB124(*(undefined1 (*) [12])(local_1a98 + -1),0);
                          iVar32 = movmskps(iVar32,auVar72);
                          local_1b98._4_4_ = fVar132;
                          local_1b98._0_4_ = fVar131;
                          uStack_1b90._0_4_ = fVar133;
                          uStack_1b90._4_4_ = fVar149;
                          local_1ac8 = auVar89._0_4_;
                          fStack_1ac4 = auVar89._4_4_;
                          fStack_1ac0 = auVar89._8_4_;
                          fStack_1abc = auVar89._12_4_;
                          local_1b08 = auVar83._0_4_;
                          fStack_1b04 = auVar83._4_4_;
                          fStack_1b00 = auVar83._8_4_;
                          fStack_1afc = auVar83._12_4_;
                          fVar148 = auVar88._0_4_;
                          fVar154 = auVar88._4_4_;
                          fVar158 = auVar88._8_4_;
                          fVar98 = auVar88._12_4_;
                          fVar99 = auStack_1c14._0_4_;
                          fVar100 = auStack_1c14._4_4_;
                          fVar104 = auStack_1c14._8_4_;
                          pRVar36 = local_1a98;
                          local_1c28 = auVar211;
                          _local_1bf8 = auVar189;
                          if (iVar32 == 0) {
LAB_006de32a:
                            uVar31 = 0;
                          }
                          else {
                            uVar173 = ((uint)uVar33 & 1) + uVar176;
                            pRVar36 = (RTCIntersectArguments *)(ulong)uVar173;
                            auVar121._0_4_ =
                                 (float)(int)(*(ushort *)((long)&pRVar37->context + lVar7) - 1);
                            auVar121._4_12_ = _auStack_1c14;
                            auVar137._4_4_ = fVar99;
                            auVar137._0_4_ = auVar121._0_4_;
                            auVar137._8_4_ = fVar100;
                            auVar137._12_4_ = fVar104;
                            auVar89 = rcpss(auVar137,auVar121);
                            fVar105 = (2.0 - auVar121._0_4_ * auVar89._0_4_) * auVar89._0_4_;
                            auVar122._0_4_ =
                                 (float)(int)(*(ushort *)((long)&pRVar37->context + lVar7 + 2) - 1);
                            auVar122._4_12_ = _auStack_1c14;
                            auVar138._4_4_ = fVar99;
                            auVar138._0_4_ = auVar122._0_4_;
                            auVar138._8_4_ = fVar100;
                            auVar138._12_4_ = fVar104;
                            auVar89 = rcpss(auVar138,auVar122);
                            fVar53 = (float)uVar173;
                            auVar171._0_4_ = fVar105 * (fVar53 * fVar148 + auVar211._0_4_);
                            auVar171._4_4_ = fVar105 * (fVar53 * fVar154 + auVar211._4_4_);
                            auVar171._8_4_ = fVar105 * (fVar53 * fVar158 + auVar211._8_4_);
                            auVar171._12_4_ = fVar105 * (fVar53 * fVar98 + auVar211._12_4_);
                            local_1c28 = blendvps(auVar211,auVar171,auVar72);
                            fVar105 = (2.0 - auVar122._0_4_ * auVar89._0_4_) * auVar89._0_4_;
                            fVar53 = (float)(int)(((uint)(uVar33 >> 1) & 0x7fffffff) + uVar179);
                            auVar21._4_4_ = fVar105 * (fVar53 * fVar154 + auVar189._4_4_);
                            auVar21._0_4_ = fVar105 * (fVar53 * fVar148 + auVar189._0_4_);
                            auVar21._8_4_ = fVar105 * (fVar53 * fVar158 + auVar189._8_4_);
                            auVar21._12_4_ = fVar105 * (fVar53 * fVar98 + auVar189._12_4_);
                            _local_1bf8 = blendvps(auVar189,auVar21,auVar72);
                            pRVar10 = (context->scene->geometries).items;
                            pGVar6 = pRVar10[*(uint *)((long)&local_1968 + uVar33 * 4)].ptr;
                            uVar173 = pGVar6->mask;
                            auVar123._0_4_ = -(uint)((uVar173 & *(uint *)(ray + 0x90)) == 0);
                            auVar123._4_4_ = -(uint)((uVar173 & *(uint *)(ray + 0x94)) == 0);
                            auVar123._8_4_ = -(uint)((uVar173 & *(uint *)(ray + 0x98)) == 0);
                            auVar123._12_4_ = -(uint)((uVar173 & *(uint *)(ray + 0x9c)) == 0);
                            aVar124 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                                      (~auVar123 & auVar72);
                            iVar32 = movmskps((int)pRVar10,(undefined1  [16])aVar124);
                            if (iVar32 == 0) goto LAB_006de32a;
                            pRVar36 = (RTCIntersectArguments *)
                                      (ulong)*(uint *)((long)&local_1978 + uVar33 * 4);
                            pRVar34 = context->args;
                            if ((pRVar34->filter != (RTCFilterFunctionN)0x0) ||
                               (pGVar6->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                              rcpps(auVar72,auVar88);
                              upper_x.field_0.i[1] = (int)fVar132;
                              upper_x.field_0.i[0] = (int)fVar131;
                              upper_x.field_0.i[3] = (int)fVar149;
                              upper_x.field_0.i[2] = (int)fVar133;
                              lower_y.field_0._0_8_ = &upper_y;
                              lower_y.field_0._8_8_ = &t;
                              std::
                              _Tuple_impl<0ul,embree::vfloat_impl<4>&,embree::vfloat_impl<4>&,embree::vfloat_impl<4>&,embree::Vec3<embree::vfloat_impl<4>>&>
                              ::
                              _M_assign<embree::vfloat_impl<4>,embree::vfloat_impl<4>,embree::vfloat_impl<4>,embree::Vec3<embree::vfloat_impl<4>>>
                                        ((_Tuple_impl<0UL,_embree::vfloat_impl<4>_&,_embree::vfloat_impl<4>_&,_embree::vfloat_impl<4>_&,_embree::Vec3<embree::vfloat_impl<4>_>_&>
                                          *)&lower_y,
                                         (_Tuple_impl<0UL,_embree::vfloat_impl<4>,_embree::vfloat_impl<4>,_embree::vfloat_impl<4>,_embree::Vec3<embree::vfloat_impl<4>_>_>
                                          *)&upper_x);
                              upper_x.field_0._0_8_ =
                                   CONCAT44(upper_y.field_0.i[1],upper_y.field_0.i[0]);
                              upper_x.field_0._8_8_ =
                                   CONCAT44(upper_y.field_0.i[3],upper_y.field_0.i[2]);
                              pRVar36 = &local_1a18;
                              local_1a18.flags = context->user->instID[0];
                              local_1a18.feature_mask = local_1a18.flags;
                              local_1a18.context._0_4_ = local_1a18.flags;
                              local_1a18.context._4_4_ = local_1a18.flags;
                              local_1a18.filter._0_4_ = context->user->instPrimID[0];
                              local_1a18.filter._4_4_ = (uint)local_1a18.filter;
                              local_1a18.intersect._0_4_ = (uint)local_1a18.filter;
                              local_1a18.intersect._4_4_ = (uint)local_1a18.filter;
                              auVar89 = *(undefined1 (*) [16])(ray + 0x80);
                              auVar83 = blendvps(auVar89,(undefined1  [16])t.field_0,
                                                 (undefined1  [16])aVar124);
                              *(undefined1 (*) [16])(ray + 0x80) = auVar83;
                              lower_z.field_0 = aVar124;
                              lower_y.field_0._0_8_ = &lower_z;
                              lower_y.field_0._8_8_ = pGVar6->userPtr;
                              pRVar34 = (RTCIntersectArguments *)pGVar6->occlusionFilterN;
                              if (pRVar34 != (RTCIntersectArguments *)0x0) {
                                pRVar34 = (RTCIntersectArguments *)(*(code *)pRVar34)(&lower_y);
                              }
                              if (lower_z.field_0 ==
                                  (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)0x0) {
                                auVar84._8_4_ = 0xffffffff;
                                auVar84._0_8_ = 0xffffffffffffffff;
                                auVar84._12_4_ = 0xffffffff;
                                auVar84 = auVar84 ^ _DAT_01f46b70;
                              }
                              else {
                                pRVar36 = context->args;
                                if ((pRVar36->filter != (RTCFilterFunctionN)0x0) &&
                                   (((pRVar36->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                                     RTC_RAY_QUERY_FLAG_INCOHERENT ||
                                    (((pGVar6->field_8).field_0x2 & 0x40) != 0)))) {
                                  (*pRVar36->filter)((RTCFilterFunctionNArguments *)&lower_y);
                                }
                                auVar68._0_4_ = -(uint)(lower_z.field_0._0_4_ == 0);
                                auVar68._4_4_ = -(uint)(lower_z.field_0._4_4_ == 0);
                                auVar68._8_4_ = -(uint)(lower_z.field_0._8_4_ == 0);
                                auVar68._12_4_ = -(uint)(lower_z.field_0._12_4_ == 0);
                                auVar84 = auVar68 ^ _DAT_01f46b70;
                                auVar83 = blendvps(_DAT_01f45a40,*(undefined1 (*) [16])(ray + 0x80),
                                                   auVar68);
                                *(undefined1 (*) [16])(ray + 0x80) = auVar83;
                                pRVar34 = (RTCIntersectArguments *)ray;
                              }
                              auVar85._0_4_ = auVar84._0_4_ << 0x1f;
                              auVar85._4_4_ = auVar84._4_4_ << 0x1f;
                              auVar85._8_4_ = auVar84._8_4_ << 0x1f;
                              auVar85._12_4_ = auVar84._12_4_ << 0x1f;
                              auVar89 = blendvps(auVar89,*(undefined1 (*) [16])(ray + 0x80),auVar85)
                              ;
                              aVar124._0_4_ = auVar85._0_4_ >> 0x1f;
                              aVar124._4_4_ = auVar85._4_4_ >> 0x1f;
                              aVar124._8_4_ = auVar85._8_4_ >> 0x1f;
                              aVar124._12_4_ = auVar85._12_4_ >> 0x1f;
                              *(undefined1 (*) [16])(ray + 0x80) = auVar89;
                              local_1b08 = *(float *)ray;
                              fStack_1b04 = *(float *)(ray + 4);
                              fStack_1b00 = *(float *)(ray + 8);
                              fStack_1afc = *(float *)(ray + 0xc);
                              fVar52 = *(float *)(ray + 0x10);
                              fVar74 = *(float *)(ray + 0x14);
                              fVar76 = *(float *)(ray + 0x18);
                              fVar95 = *(float *)(ray + 0x1c);
                              local_1ac8 = *(float *)(ray + 0x20);
                              fStack_1ac4 = *(float *)(ray + 0x24);
                              fStack_1ac0 = *(float *)(ray + 0x28);
                              fStack_1abc = *(float *)(ray + 0x2c);
                              local_1bc8 = *(undefined8 *)(ray + 0x40);
                              uStack_1bc0 = *(undefined8 *)(ray + 0x48);
                              local_1bd8 = *(undefined8 *)(ray + 0x50);
                              uStack_1bd0 = *(undefined8 *)(ray + 0x58);
                              local_1be8 = *(undefined8 *)(ray + 0x60);
                              uStack_1be0 = *(undefined8 *)(ray + 0x68);
                            }
                            uVar31 = SUB84(pRVar34,0);
                            local_1c48 = ~(undefined1  [16])aVar124 & local_1c48;
                          }
                          fVar113 = fVar75 - local_1b88;
                          fVar132 = fVar75 - local_1b88;
                          fVar149 = fVar75 - local_1b88;
                          local_1b88 = fVar75 - local_1b88;
                          fVar199 = fVar78 - fVar146;
                          fVar200 = fVar78 - fVar146;
                          fVar201 = fVar78 - fVar146;
                          fVar146 = fVar78 - fVar146;
                          fVar105 = fVar94 - fVar163;
                          fVar106 = fVar94 - fVar163;
                          fVar107 = fVar94 - fVar163;
                          fVar163 = fVar94 - fVar163;
                          fVar194 = (float)local_1c08._0_4_ - fVar75;
                          fVar195 = (float)local_1c08._0_4_ - fVar75;
                          fVar196 = (float)local_1c08._0_4_ - fVar75;
                          fVar198 = (float)local_1c08._0_4_ - fVar75;
                          fVar53 = fVar162 - fVar78;
                          fVar114 = fVar162 - fVar78;
                          fVar117 = fVar162 - fVar78;
                          fVar162 = fVar162 - fVar78;
                          fVar182 = fVar197 - fVar94;
                          fVar185 = fVar197 - fVar94;
                          fVar186 = fVar197 - fVar94;
                          fVar197 = fVar197 - fVar94;
                          fVar175 = fVar53 * fVar105 - fVar182 * fVar199;
                          fVar177 = fVar114 * fVar106 - fVar185 * fVar200;
                          auVar140._4_4_ = fVar177;
                          auVar140._0_4_ = fVar175;
                          fVar178 = fVar117 * fVar107 - fVar186 * fVar201;
                          fVar180 = fVar162 * fVar163 - fVar197 * fVar146;
                          fVar187 = fVar182 * fVar113 - fVar194 * fVar105;
                          fVar191 = fVar185 * fVar132 - fVar195 * fVar106;
                          fVar192 = fVar186 * fVar149 - fVar196 * fVar107;
                          fVar193 = fVar197 * local_1b88 - fVar198 * fVar163;
                          auVar110._0_4_ = fVar194 * fVar199 - fVar53 * fVar113;
                          auVar110._4_4_ = fVar195 * fVar200 - fVar114 * fVar132;
                          auVar110._8_4_ = fVar196 * fVar201 - fVar117 * fVar149;
                          auVar110._12_4_ = fVar198 * fVar146 - fVar162 * local_1b88;
                          auVar115 = auVar110._4_12_;
                          local_1b08 = fVar75 - local_1b08;
                          fStack_1b04 = fVar75 - fStack_1b04;
                          fStack_1b00 = fVar75 - fStack_1b00;
                          fVar75 = fVar75 - fStack_1afc;
                          fVar52 = fVar78 - fVar52;
                          fVar74 = fVar78 - fVar74;
                          fVar76 = fVar78 - fVar76;
                          fVar78 = fVar78 - fVar95;
                          local_1ac8 = fVar94 - local_1ac8;
                          fStack_1ac4 = fVar94 - fStack_1ac4;
                          fStack_1ac0 = fVar94 - fStack_1ac0;
                          fVar94 = fVar94 - fStack_1abc;
                          fVar120 = fVar52 * (float)local_1be8 - local_1ac8 * (float)local_1bd8;
                          fVar134 = fVar74 * local_1be8._4_4_ - fStack_1ac4 * local_1bd8._4_4_;
                          fVar142 = fVar76 * (float)uStack_1be0 - fStack_1ac0 * (float)uStack_1bd0;
                          fVar144 = fVar78 * uStack_1be0._4_4_ - fVar94 * uStack_1bd0._4_4_;
                          fVar147 = local_1ac8 * (float)local_1bc8 - local_1b08 * (float)local_1be8;
                          fVar151 = fStack_1ac4 * local_1bc8._4_4_ - fStack_1b04 * local_1be8._4_4_;
                          fVar157 = fStack_1ac0 * (float)uStack_1bc0 -
                                    fStack_1b00 * (float)uStack_1be0;
                          fVar161 = fVar94 * uStack_1bc0._4_4_ - fVar75 * uStack_1be0._4_4_;
                          fVar165 = local_1b08 * (float)local_1bd8 - fVar52 * (float)local_1bc8;
                          fVar167 = fStack_1b04 * local_1bd8._4_4_ - fVar74 * local_1bc8._4_4_;
                          fVar168 = fStack_1b00 * (float)uStack_1bd0 - fVar76 * (float)uStack_1bc0;
                          fVar174 = fVar75 * uStack_1bd0._4_4_ - fVar78 * uStack_1bc0._4_4_;
                          fVar131 = (float)local_1bc8 * fVar175 +
                                    (float)local_1bd8 * fVar187 + (float)local_1be8 * auVar110._0_4_
                          ;
                          fVar133 = local_1bc8._4_4_ * fVar177 +
                                    local_1bd8._4_4_ * fVar191 + local_1be8._4_4_ * auVar110._4_4_;
                          fVar155 = (float)uStack_1bc0 * fVar178 +
                                    (float)uStack_1bd0 * fVar192 +
                                    (float)uStack_1be0 * auVar110._8_4_;
                          fVar159 = uStack_1bc0._4_4_ * fVar180 +
                                    uStack_1bd0._4_4_ * fVar193 +
                                    uStack_1be0._4_4_ * auVar110._12_4_;
                          uVar173 = (uint)fVar131 & 0x80000000;
                          uVar156 = (uint)fVar133 & 0x80000000;
                          uVar160 = (uint)fVar155 & 0x80000000;
                          uVar164 = (uint)fVar159 & 0x80000000;
                          local_1c08._0_4_ =
                               (uint)(fVar194 * fVar120 + fVar53 * fVar147 + fVar182 * fVar165) ^
                               uVar173;
                          local_1c08._4_4_ =
                               (uint)(fVar195 * fVar134 + fVar114 * fVar151 + fVar185 * fVar167) ^
                               uVar156;
                          fStack_1c00 = (float)((uint)(fVar196 * fVar142 +
                                                      fVar117 * fVar157 + fVar186 * fVar168) ^
                                               uVar160);
                          fStack_1bfc = (float)((uint)(fVar198 * fVar144 +
                                                      fVar162 * fVar161 + fVar197 * fVar174) ^
                                               uVar164);
                          auVar102._0_4_ =
                               -(uint)(0.0 <= (float)local_1c08._0_4_) & local_1c48._0_4_;
                          auVar102._4_4_ =
                               -(uint)(0.0 <= (float)local_1c08._4_4_) & local_1c48._4_4_;
                          auVar102._8_4_ = -(uint)(0.0 <= fStack_1c00) & local_1c48._8_4_;
                          auVar102._12_4_ = -(uint)(0.0 <= fStack_1bfc) & local_1c48._12_4_;
                          iVar32 = movmskps(uVar31,auVar102);
                          auVar128 = local_1c28;
                          auVar140 = _local_1b98;
                          fVar197 = fVar99;
                          fVar95 = fVar100;
                          fVar53 = fVar104;
                          in_XMM15 = _local_1bf8;
                          if (iVar32 == 0) {
                            auVar71._8_8_ = uVar29;
                            auVar71._0_8_ = uVar28;
                            auVar24._4_4_ = fVar118;
                            auVar24._0_4_ = fVar116;
                            auVar24._8_4_ = fVar119;
                            auVar24._12_4_ = 0;
                            _local_1ba8 = auVar24 << 0x20;
                            iVar32 = 0;
                            fVar162 = fVar148;
                            fVar146 = fVar154;
                            fVar163 = fVar158;
                            fVar105 = fVar98;
                          }
                          else {
                            local_1c58._0_4_ =
                                 (uint)(fVar113 * fVar120 + fVar199 * fVar147 + fVar105 * fVar165) ^
                                 uVar173;
                            local_1c58._4_4_ =
                                 (uint)(fVar132 * fVar134 + fVar200 * fVar151 + fVar106 * fVar167) ^
                                 uVar156;
                            fStack_1c50 = (float)((uint)(fVar149 * fVar142 +
                                                        fVar201 * fVar157 + fVar107 * fVar168) ^
                                                 uVar160);
                            fStack_1c4c = (float)((uint)(local_1b88 * fVar144 +
                                                        fVar146 * fVar161 + fVar163 * fVar174) ^
                                                 uVar164);
                            auVar129._0_4_ =
                                 -(uint)(0.0 <= (float)local_1c58._0_4_) & auVar102._0_4_;
                            auVar129._4_4_ =
                                 -(uint)(0.0 <= (float)local_1c58._4_4_) & auVar102._4_4_;
                            auVar129._8_4_ = -(uint)(0.0 <= fStack_1c50) & auVar102._8_4_;
                            auVar129._12_4_ = -(uint)(0.0 <= fStack_1c4c) & auVar102._12_4_;
                            iVar32 = movmskps(iVar32,auVar129);
                            if (iVar32 != 0) {
                              fVar162 = ABS(fVar131);
                              fVar146 = ABS(fVar133);
                              fVar163 = ABS(fVar155);
                              fVar105 = ABS(fVar159);
                              auVar70._0_4_ =
                                   -(uint)((float)local_1c58._0_4_ <=
                                          fVar162 - (float)local_1c08._0_4_) & auVar129._0_4_;
                              auVar70._4_4_ =
                                   -(uint)((float)local_1c58._4_4_ <=
                                          fVar146 - (float)local_1c08._4_4_) & auVar129._4_4_;
                              auVar70._8_4_ =
                                   -(uint)(fStack_1c50 <= fVar163 - fStack_1c00) & auVar129._8_4_;
                              auVar70._12_4_ =
                                   -(uint)(fStack_1c4c <= fVar105 - fStack_1bfc) & auVar129._12_4_;
                              iVar32 = movmskps(iVar32,auVar70);
                              if (iVar32 != 0) {
                                fVar52 = (float)(uVar173 ^
                                                (uint)(local_1b08 * fVar175 +
                                                      fVar52 * fVar187 + local_1ac8 * auVar110._0_4_
                                                      ));
                                fVar74 = (float)(uVar156 ^
                                                (uint)(fStack_1b04 * fVar177 +
                                                      fVar74 * fVar191 +
                                                      fStack_1ac4 * auVar110._4_4_));
                                fVar76 = (float)(uVar160 ^
                                                (uint)(fStack_1b00 * fVar178 +
                                                      fVar76 * fVar192 +
                                                      fStack_1ac0 * auVar110._8_4_));
                                fVar75 = (float)(uVar164 ^
                                                (uint)(fVar75 * fVar180 +
                                                      fVar78 * fVar193 + fVar94 * auVar110._12_4_));
                                bVar51 = *(float *)(ray + 0x34) * fVar146 < fVar74;
                                bVar11 = *(float *)(ray + 0x38) * fVar163 < fVar76;
                                bVar12 = *(float *)(ray + 0x3c) * fVar105 < fVar75;
                                auVar115._4_4_ = -(uint)bVar11;
                                auVar115._0_4_ = -(uint)bVar51;
                                auVar115._8_4_ = -(uint)bVar12;
                                auVar103._0_4_ =
                                     -(uint)(fVar52 <= *(float *)(ray + 0x80) * fVar162 &&
                                            *(float *)(ray + 0x30) * fVar162 < fVar52) &
                                     auVar70._0_4_;
                                auVar103._4_4_ =
                                     -(uint)(fVar74 <= *(float *)(ray + 0x84) * fVar146 && bVar51) &
                                     auVar70._4_4_;
                                auVar103._8_4_ =
                                     -(uint)(fVar76 <= *(float *)(ray + 0x88) * fVar163 && bVar11) &
                                     auVar70._8_4_;
                                auVar103._12_4_ =
                                     -(uint)(fVar75 <= *(float *)(ray + 0x8c) * fVar105 && bVar12) &
                                     auVar70._12_4_;
                                iVar32 = movmskps(iVar32,auVar103);
                                if (iVar32 != 0) {
                                  local_1ba8._4_4_ = fVar191;
                                  local_1ba8._0_4_ = fVar187;
                                  fStack_1ba0 = fVar192;
                                  fStack_1b9c = fVar193;
                                  auVar140._8_4_ = fVar178;
                                  auVar140._12_4_ = fVar180;
                                  auVar71._0_4_ = -(uint)(fVar131 != 0.0) & auVar103._0_4_;
                                  auVar71._4_4_ = -(uint)(fVar133 != 0.0) & auVar103._4_4_;
                                  auVar71._8_4_ = -(uint)(fVar155 != 0.0) & auVar103._8_4_;
                                  auVar71._12_4_ = -(uint)(fVar159 != 0.0) & auVar103._12_4_;
                                  iVar32 = movmskps(iVar32,auVar71);
                                  auVar128 = _local_1c08;
                                  fVar197 = auVar110._4_4_;
                                  fVar95 = auVar110._8_4_;
                                  fVar53 = auVar110._12_4_;
                                  in_XMM15 = _local_1c58;
                                  if (iVar32 == 0) {
                                    auVar71._8_8_ = uVar29;
                                    auVar71._0_8_ = uVar28;
                                    auVar26._4_4_ = fVar118;
                                    auVar26._0_4_ = fVar116;
                                    auVar26._8_4_ = fVar119;
                                    auVar26._12_4_ = 0;
                                    _local_1ba8 = auVar26 << 0x20;
                                    auVar128 = local_1c28;
                                    auVar140 = _local_1b98;
                                    fVar162 = fVar148;
                                    fVar146 = fVar154;
                                    fVar163 = fVar158;
                                    fVar105 = fVar98;
                                    fVar197 = fVar99;
                                    fVar95 = fVar100;
                                    fVar53 = fVar104;
                                    in_XMM15 = _local_1bf8;
                                  }
                                  goto LAB_006de4cd;
                                }
                                iVar32 = 0;
                              }
                            }
                            auVar71._8_8_ = uVar29;
                            auVar71._0_8_ = uVar28;
                            auVar25._4_4_ = fVar118;
                            auVar25._0_4_ = fVar116;
                            auVar25._8_4_ = fVar119;
                            auVar25._12_4_ = 0;
                            _local_1ba8 = auVar25 << 0x20;
                            fVar162 = fVar148;
                            fVar146 = fVar154;
                            fVar163 = fVar158;
                            fVar105 = fVar98;
                          }
LAB_006de4cd:
                          iVar32 = movmskps(iVar32,auVar71);
                          local_1bf8._4_4_ = fVar146;
                          local_1bf8._0_4_ = fVar162;
                          fStack_1bf0 = fVar163;
                          fStack_1bec = fVar105;
                          if (iVar32 == 0) {
                            uVar31 = 0;
                          }
                          else {
                            fVar148 = fVar162 - auVar128._0_4_;
                            fVar154 = fVar146 - auVar128._4_4_;
                            auVar127._4_4_ = fVar154;
                            auVar127._0_4_ = fVar148;
                            fVar158 = fVar163 - auVar128._8_4_;
                            fVar52 = fVar105 - auVar128._12_4_;
                            fVar74 = fVar162 - in_XMM15._0_4_;
                            fVar76 = fVar146 - in_XMM15._4_4_;
                            auVar210._4_4_ = fVar76;
                            auVar210._0_4_ = fVar74;
                            fVar75 = fVar163 - in_XMM15._8_4_;
                            fVar78 = fVar105 - in_XMM15._12_4_;
                            uVar173 = ((uint)uVar33 & 1) + uVar176;
                            pRVar36 = (RTCIntersectArguments *)(ulong)uVar173;
                            auVar111._0_4_ =
                                 (float)(int)(*(ushort *)((long)&pRVar37->context + lVar7) - 1);
                            auVar111._4_12_ = auVar115;
                            auVar125._4_4_ = auVar115._0_4_;
                            auVar125._0_4_ = auVar111._0_4_;
                            auVar125._8_4_ = auVar115._4_4_;
                            auVar125._12_4_ = auVar115._8_4_;
                            auVar89 = rcpss(auVar125,auVar111);
                            auVar153._4_12_ = local_1ba8._4_12_;
                            auVar153._0_4_ =
                                 (float)(int)(*(ushort *)((long)&pRVar37->context + lVar7 + 2) - 1);
                            fVar99 = (2.0 - auVar111._0_4_ * auVar89._0_4_) * auVar89._0_4_;
                            auVar126._4_4_ = local_1ba8._4_4_;
                            auVar126._0_4_ = auVar153._0_4_;
                            auVar126._8_4_ = local_1ba8._8_4_;
                            auVar126._12_4_ = local_1ba8._12_4_;
                            auVar89 = rcpss(auVar126,auVar153);
                            fVar94 = (2.0 - auVar153._0_4_ * auVar89._0_4_) * auVar89._0_4_;
                            fVar98 = (float)uVar173;
                            auVar139._0_4_ = fVar99 * (fVar98 * fVar162 + fVar148);
                            auVar139._4_4_ = fVar99 * (fVar98 * fVar146 + fVar154);
                            auVar139._8_4_ = fVar99 * (fVar98 * fVar163 + fVar158);
                            auVar139._12_4_ = fVar99 * (fVar98 * fVar105 + fVar52);
                            auVar127._8_4_ = fVar158;
                            auVar127._12_4_ = fVar52;
                            auVar128 = blendvps(auVar127,auVar139,auVar71);
                            fVar148 = (float)(int)(((uint)(uVar33 >> 1) & 0x7fffffff) + uVar179);
                            auVar112._0_4_ = fVar94 * (fVar148 * fVar162 + fVar74);
                            auVar112._4_4_ = fVar94 * (fVar148 * fVar146 + fVar76);
                            auVar112._8_4_ = fVar94 * (fVar148 * fVar163 + fVar75);
                            auVar112._12_4_ = fVar94 * (fVar148 * fVar105 + fVar78);
                            auVar210._8_4_ = fVar75;
                            auVar210._12_4_ = fVar78;
                            in_XMM15 = blendvps(auVar210,auVar112,auVar71);
                            pRVar10 = (context->scene->geometries).items;
                            pGVar6 = pRVar10[*(uint *)((long)&local_1968 + uVar33 * 4)].ptr;
                            uVar173 = pGVar6->mask;
                            auVar204._0_4_ = -(uint)((uVar173 & *(uint *)(ray + 0x90)) == 0);
                            auVar204._4_4_ = -(uint)((uVar173 & *(uint *)(ray + 0x94)) == 0);
                            auVar204._8_4_ = -(uint)((uVar173 & *(uint *)(ray + 0x98)) == 0);
                            auVar204._12_4_ = -(uint)((uVar173 & *(uint *)(ray + 0x9c)) == 0);
                            aVar205 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                                      (~auVar204 & auVar71);
                            iVar32 = movmskps((int)pRVar10,(undefined1  [16])aVar205);
                            if (iVar32 == 0) {
                              uVar31 = 0;
                            }
                            else {
                              pRVar36 = (RTCIntersectArguments *)
                                        (ulong)*(uint *)((long)&local_1978 + uVar33 * 4);
                              pRVar34 = context->args;
                              if ((pRVar34->filter != (RTCFilterFunctionN)0x0) ||
                                 (pGVar6->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                                rcpps(auVar71,_local_1bf8);
                                local_1b98 = auVar140._0_8_;
                                uStack_1b90 = auVar140._8_8_;
                                upper_x.field_0._0_8_ = local_1b98;
                                upper_x.field_0._8_8_ = uStack_1b90;
                                lower_y.field_0._0_8_ = &upper_y;
                                lower_y.field_0._8_8_ = &t;
                                std::
                                _Tuple_impl<0ul,embree::vfloat_impl<4>&,embree::vfloat_impl<4>&,embree::vfloat_impl<4>&,embree::Vec3<embree::vfloat_impl<4>>&>
                                ::
                                _M_assign<embree::vfloat_impl<4>,embree::vfloat_impl<4>,embree::vfloat_impl<4>,embree::Vec3<embree::vfloat_impl<4>>>
                                          ((_Tuple_impl<0UL,_embree::vfloat_impl<4>_&,_embree::vfloat_impl<4>_&,_embree::vfloat_impl<4>_&,_embree::Vec3<embree::vfloat_impl<4>_>_&>
                                            *)&lower_y,
                                           (_Tuple_impl<0UL,_embree::vfloat_impl<4>,_embree::vfloat_impl<4>,_embree::vfloat_impl<4>,_embree::Vec3<embree::vfloat_impl<4>_>_>
                                            *)&upper_x);
                                upper_x.field_0._0_8_ =
                                     CONCAT44(upper_y.field_0.i[1],upper_y.field_0.i[0]);
                                upper_x.field_0._8_8_ =
                                     CONCAT44(upper_y.field_0.i[3],upper_y.field_0.i[2]);
                                pRVar36 = &local_1a18;
                                local_1a18.flags = context->user->instID[0];
                                local_1a18.feature_mask = local_1a18.flags;
                                local_1a18.context._0_4_ = local_1a18.flags;
                                local_1a18.context._4_4_ = local_1a18.flags;
                                local_1a18.filter._0_4_ = context->user->instPrimID[0];
                                local_1a18.filter._4_4_ = (uint)local_1a18.filter;
                                local_1a18.intersect._0_4_ = (uint)local_1a18.filter;
                                local_1a18.intersect._4_4_ = (uint)local_1a18.filter;
                                auVar89 = *(undefined1 (*) [16])(ray + 0x80);
                                auVar83 = blendvps(auVar89,(undefined1  [16])t.field_0,
                                                   (undefined1  [16])aVar205);
                                *(undefined1 (*) [16])(ray + 0x80) = auVar83;
                                lower_z.field_0 = aVar205;
                                lower_y.field_0._0_8_ = &lower_z;
                                lower_y.field_0._8_8_ = pGVar6->userPtr;
                                pRVar34 = (RTCIntersectArguments *)pGVar6->occlusionFilterN;
                                if (pRVar34 != (RTCIntersectArguments *)0x0) {
                                  pRVar34 = (RTCIntersectArguments *)(*(code *)pRVar34)(&lower_y);
                                }
                                if (lower_z.field_0 ==
                                    (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)0x0) {
                                  auVar86._8_4_ = 0xffffffff;
                                  auVar86._0_8_ = 0xffffffffffffffff;
                                  auVar86._12_4_ = 0xffffffff;
                                  auVar86 = auVar86 ^ _DAT_01f46b70;
                                }
                                else {
                                  pRVar36 = context->args;
                                  if ((pRVar36->filter != (RTCFilterFunctionN)0x0) &&
                                     (((pRVar36->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER)
                                       != RTC_RAY_QUERY_FLAG_INCOHERENT ||
                                      (((pGVar6->field_8).field_0x2 & 0x40) != 0)))) {
                                    (*pRVar36->filter)((RTCFilterFunctionNArguments *)&lower_y);
                                  }
                                  auVar69._0_4_ = -(uint)(lower_z.field_0._0_4_ == 0);
                                  auVar69._4_4_ = -(uint)(lower_z.field_0._4_4_ == 0);
                                  auVar69._8_4_ = -(uint)(lower_z.field_0._8_4_ == 0);
                                  auVar69._12_4_ = -(uint)(lower_z.field_0._12_4_ == 0);
                                  auVar86 = auVar69 ^ _DAT_01f46b70;
                                  auVar83 = blendvps(_DAT_01f45a40,
                                                     *(undefined1 (*) [16])(ray + 0x80),auVar69);
                                  *(undefined1 (*) [16])(ray + 0x80) = auVar83;
                                  pRVar34 = (RTCIntersectArguments *)ray;
                                }
                                auVar87._0_4_ = auVar86._0_4_ << 0x1f;
                                auVar87._4_4_ = auVar86._4_4_ << 0x1f;
                                auVar87._8_4_ = auVar86._8_4_ << 0x1f;
                                auVar87._12_4_ = auVar86._12_4_ << 0x1f;
                                aVar205._0_4_ = auVar87._0_4_ >> 0x1f;
                                aVar205._4_4_ = auVar87._4_4_ >> 0x1f;
                                aVar205._8_4_ = auVar87._8_4_ >> 0x1f;
                                aVar205._12_4_ = auVar87._12_4_ >> 0x1f;
                                auVar89 = blendvps(auVar89,*(undefined1 (*) [16])(ray + 0x80),
                                                   auVar87);
                                *(undefined1 (*) [16])(ray + 0x80) = auVar89;
                              }
                              uVar31 = SUB84(pRVar34,0);
                              local_1c48 = ~(undefined1  [16])aVar205 & local_1c48;
                            }
                          }
                          fVar162 = INFINITY;
                          fVar158 = INFINITY;
                          fVar154 = INFINITY;
                          fVar148 = INFINITY;
                          uVar173 = movmskps(uVar31,local_1c48);
                          pRVar34 = (RTCIntersectArguments *)(ulong)uVar173;
                          uVar33 = uVar33 + 1;
                          local_1a98 = local_1a98 + 2;
                          in_XMM13_Da = auVar128._0_4_;
                          in_XMM13_Db = auVar128._4_4_;
                          in_XMM13_Dc = auVar128._8_4_;
                          in_XMM13_Dd = auVar128._12_4_;
                          _local_1b98 = auVar140;
                        } while (uVar173 != 0);
                        uVar31 = 0;
                        auVar89 = local_1c48;
LAB_006df323:
                        local_1c48._0_4_ = uVar150 & auVar89._0_4_;
                        local_1c48._4_4_ = uVar166 & auVar89._4_4_;
                        local_1c48._8_4_ = uVar141 & auVar89._8_4_;
                        local_1c48._12_4_ = uVar143 & auVar89._12_4_;
                        iVar32 = movmskps(uVar31,local_1c48);
                        bVar51 = iVar32 == 0;
                        in_XMM13_Da = auVar128._0_4_;
                        in_XMM13_Db = auVar128._4_4_;
                        in_XMM13_Dc = auVar128._8_4_;
                        in_XMM13_Dd = auVar128._12_4_;
                      }
                    } while ((!bVar51) && (uVar41 = uVar41 & uVar41 - 1, uVar41 != 0));
                  }
                }
                auVar190._0_8_ = local_1c48._0_8_ ^ 0xffffffffffffffff;
                auVar190._8_4_ = local_1c48._8_4_ ^ 0xffffffff;
                auVar190._12_4_ = local_1c48._12_4_ ^ 0xffffffff;
                terminated.field_0 =
                     (anon_union_16_2_9473010e_for_vboolf_impl<4>_1)
                     (auVar190 | (undefined1  [16])terminated.field_0);
                uVar30 = movmskps((int)lVar35,(undefined1  [16])terminated.field_0);
                if (uVar30 == 0xf) goto LAB_006df4a2;
                auVar27._4_4_ = fVar95;
                auVar27._0_4_ = fVar197;
                auVar27._8_4_ = fVar53;
                auVar27._12_4_ = 0;
                in_XMM14 = auVar27 << 0x20;
                tray.tfar.field_0 =
                     (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                     blendvps((undefined1  [16])tray.tfar.field_0,_DAT_01f45a40,
                              (undefined1  [16])terminated.field_0);
              }
              goto LAB_006dd88f;
            }
            sVar44 = 8;
            fVar197 = fVar148;
            fVar95 = fVar154;
            fVar53 = fVar158;
            fVar146 = fVar162;
            for (pRVar36 = (RTCIntersectArguments *)0x0;
                (pRVar36 != (RTCIntersectArguments *)&DAT_00000004 &&
                (sVar40 = *(size_t *)((root.ptr & 0xfffffffffffffff0) + (long)pRVar36 * 8),
                sVar40 != 8)); pRVar36 = (RTCIntersectArguments *)((long)&pRVar36->flags + 1)) {
              fVar163 = *(float *)(root.ptr + 0x20 + (long)pRVar36 * 4);
              fVar52 = *(float *)(root.ptr + 0x30 + (long)pRVar36 * 4);
              fVar74 = *(float *)(root.ptr + 0x40 + (long)pRVar36 * 4);
              fVar76 = *(float *)(root.ptr + 0x50 + (long)pRVar36 * 4);
              fVar100 = (fVar163 - (float)tray.org.field_0._0_4_) * (float)tray.rdir.field_0._0_4_;
              fVar104 = (fVar163 - (float)tray.org.field_0._4_4_) * (float)tray.rdir.field_0._4_4_;
              fVar105 = (fVar163 - (float)tray.org.field_0._8_4_) * (float)tray.rdir.field_0._8_4_;
              fVar106 = (fVar163 - (float)tray.org.field_0._12_4_) * (float)tray.rdir.field_0._12_4_
              ;
              fVar107 = (fVar74 - (float)tray.org.field_0._16_4_) * (float)tray.rdir.field_0._16_4_;
              fVar113 = (fVar74 - (float)tray.org.field_0._20_4_) * (float)tray.rdir.field_0._20_4_;
              fVar116 = (fVar74 - (float)tray.org.field_0._24_4_) * (float)tray.rdir.field_0._24_4_;
              fVar118 = (fVar74 - (float)tray.org.field_0._28_4_) * (float)tray.rdir.field_0._28_4_;
              fVar163 = *(float *)(root.ptr + 0x60 + (long)pRVar36 * 4);
              fVar119 = (fVar163 - (float)tray.org.field_0._32_4_) * (float)tray.rdir.field_0._32_4_
              ;
              fVar131 = (fVar163 - (float)tray.org.field_0._36_4_) * (float)tray.rdir.field_0._36_4_
              ;
              fVar132 = (fVar163 - (float)tray.org.field_0._40_4_) * (float)tray.rdir.field_0._40_4_
              ;
              fVar133 = (fVar163 - (float)tray.org.field_0._44_4_) * (float)tray.rdir.field_0._44_4_
              ;
              fVar78 = (fVar52 - (float)tray.org.field_0._0_4_) * (float)tray.rdir.field_0._0_4_;
              fVar94 = (fVar52 - (float)tray.org.field_0._4_4_) * (float)tray.rdir.field_0._4_4_;
              fVar98 = (fVar52 - (float)tray.org.field_0._8_4_) * (float)tray.rdir.field_0._8_4_;
              fVar99 = (fVar52 - (float)tray.org.field_0._12_4_) * (float)tray.rdir.field_0._12_4_;
              fVar52 = (fVar76 - (float)tray.org.field_0._16_4_) * (float)tray.rdir.field_0._16_4_;
              fVar74 = (fVar76 - (float)tray.org.field_0._20_4_) * (float)tray.rdir.field_0._20_4_;
              fVar75 = (fVar76 - (float)tray.org.field_0._24_4_) * (float)tray.rdir.field_0._24_4_;
              fVar76 = (fVar76 - (float)tray.org.field_0._28_4_) * (float)tray.rdir.field_0._28_4_;
              fVar163 = *(float *)(root.ptr + 0x70 + (long)pRVar36 * 4);
              fVar149 = (fVar163 - (float)tray.org.field_0._32_4_) * (float)tray.rdir.field_0._32_4_
              ;
              fVar155 = (fVar163 - (float)tray.org.field_0._36_4_) * (float)tray.rdir.field_0._36_4_
              ;
              fVar159 = (fVar163 - (float)tray.org.field_0._40_4_) * (float)tray.rdir.field_0._40_4_
              ;
              fVar163 = (fVar163 - (float)tray.org.field_0._44_4_) * (float)tray.rdir.field_0._44_4_
              ;
              uVar30 = (uint)((int)fVar78 < (int)fVar100) * (int)fVar78 |
                       (uint)((int)fVar78 >= (int)fVar100) * (int)fVar100;
              uVar141 = (uint)((int)fVar94 < (int)fVar104) * (int)fVar94 |
                        (uint)((int)fVar94 >= (int)fVar104) * (int)fVar104;
              uVar143 = (uint)((int)fVar98 < (int)fVar105) * (int)fVar98 |
                        (uint)((int)fVar98 >= (int)fVar105) * (int)fVar105;
              uVar145 = (uint)((int)fVar99 < (int)fVar106) * (int)fVar99 |
                        (uint)((int)fVar99 >= (int)fVar106) * (int)fVar106;
              uVar166 = (uint)((int)fVar52 < (int)fVar107) * (int)fVar52 |
                        (uint)((int)fVar52 >= (int)fVar107) * (int)fVar107;
              uVar173 = (uint)((int)fVar74 < (int)fVar113) * (int)fVar74 |
                        (uint)((int)fVar74 >= (int)fVar113) * (int)fVar113;
              uVar176 = (uint)((int)fVar75 < (int)fVar116) * (int)fVar75 |
                        (uint)((int)fVar75 >= (int)fVar116) * (int)fVar116;
              uVar179 = (uint)((int)fVar76 < (int)fVar118) * (int)fVar76 |
                        (uint)((int)fVar76 >= (int)fVar118) * (int)fVar118;
              uVar166 = ((int)uVar166 < (int)uVar30) * uVar30 |
                        ((int)uVar166 >= (int)uVar30) * uVar166;
              uVar173 = ((int)uVar173 < (int)uVar141) * uVar141 |
                        ((int)uVar173 >= (int)uVar141) * uVar173;
              uVar176 = ((int)uVar176 < (int)uVar143) * uVar143 |
                        ((int)uVar176 >= (int)uVar143) * uVar176;
              uVar179 = ((int)uVar179 < (int)uVar145) * uVar145 |
                        ((int)uVar179 >= (int)uVar145) * uVar179;
              uVar30 = (uint)((int)fVar149 < (int)fVar119) * (int)fVar149 |
                       (uint)((int)fVar149 >= (int)fVar119) * (int)fVar119;
              uVar141 = (uint)((int)fVar155 < (int)fVar131) * (int)fVar155 |
                        (uint)((int)fVar155 >= (int)fVar131) * (int)fVar131;
              uVar143 = (uint)((int)fVar159 < (int)fVar132) * (int)fVar159 |
                        (uint)((int)fVar159 >= (int)fVar132) * (int)fVar132;
              uVar145 = (uint)((int)fVar163 < (int)fVar133) * (int)fVar163 |
                        (uint)((int)fVar163 >= (int)fVar133) * (int)fVar133;
              auVar136._0_4_ =
                   ((int)uVar30 < (int)uVar166) * uVar166 | ((int)uVar30 >= (int)uVar166) * uVar30;
              auVar136._4_4_ =
                   ((int)uVar141 < (int)uVar173) * uVar173 |
                   ((int)uVar141 >= (int)uVar173) * uVar141;
              auVar136._8_4_ =
                   ((int)uVar143 < (int)uVar176) * uVar176 |
                   ((int)uVar143 >= (int)uVar176) * uVar143;
              auVar136._12_4_ =
                   ((int)uVar145 < (int)uVar179) * uVar179 |
                   ((int)uVar145 >= (int)uVar179) * uVar145;
              uVar166 = (uint)((int)fVar78 < (int)fVar100) * (int)fVar100 |
                        (uint)((int)fVar78 >= (int)fVar100) * (int)fVar78;
              uVar173 = (uint)((int)fVar94 < (int)fVar104) * (int)fVar104 |
                        (uint)((int)fVar94 >= (int)fVar104) * (int)fVar94;
              uVar176 = (uint)((int)fVar98 < (int)fVar105) * (int)fVar105 |
                        (uint)((int)fVar98 >= (int)fVar105) * (int)fVar98;
              uVar179 = (uint)((int)fVar99 < (int)fVar106) * (int)fVar106 |
                        (uint)((int)fVar99 >= (int)fVar106) * (int)fVar99;
              uVar30 = (uint)((int)fVar52 < (int)fVar107) * (int)fVar107 |
                       (uint)((int)fVar52 >= (int)fVar107) * (int)fVar52;
              uVar141 = (uint)((int)fVar74 < (int)fVar113) * (int)fVar113 |
                        (uint)((int)fVar74 >= (int)fVar113) * (int)fVar74;
              uVar143 = (uint)((int)fVar75 < (int)fVar116) * (int)fVar116 |
                        (uint)((int)fVar75 >= (int)fVar116) * (int)fVar75;
              uVar145 = (uint)((int)fVar76 < (int)fVar118) * (int)fVar118 |
                        (uint)((int)fVar76 >= (int)fVar118) * (int)fVar76;
              uVar30 = ((int)uVar166 < (int)uVar30) * uVar166 |
                       ((int)uVar166 >= (int)uVar30) * uVar30;
              uVar141 = ((int)uVar173 < (int)uVar141) * uVar173 |
                        ((int)uVar173 >= (int)uVar141) * uVar141;
              uVar143 = ((int)uVar176 < (int)uVar143) * uVar176 |
                        ((int)uVar176 >= (int)uVar143) * uVar143;
              uVar145 = ((int)uVar179 < (int)uVar145) * uVar179 |
                        ((int)uVar179 >= (int)uVar145) * uVar145;
              uVar166 = (uint)((int)fVar149 < (int)fVar119) * (int)fVar119 |
                        (uint)((int)fVar149 >= (int)fVar119) * (int)fVar149;
              uVar173 = (uint)((int)fVar155 < (int)fVar131) * (int)fVar131 |
                        (uint)((int)fVar155 >= (int)fVar131) * (int)fVar155;
              uVar176 = (uint)((int)fVar159 < (int)fVar132) * (int)fVar132 |
                        (uint)((int)fVar159 >= (int)fVar132) * (int)fVar159;
              uVar179 = (uint)((int)fVar163 < (int)fVar133) * (int)fVar133 |
                        (uint)((int)fVar163 >= (int)fVar133) * (int)fVar163;
              uVar30 = ((int)uVar30 < (int)uVar166) * uVar30 |
                       ((int)uVar30 >= (int)uVar166) * uVar166;
              uVar141 = ((int)uVar141 < (int)uVar173) * uVar141 |
                        ((int)uVar141 >= (int)uVar173) * uVar173;
              uVar143 = ((int)uVar143 < (int)uVar176) * uVar143 |
                        ((int)uVar143 >= (int)uVar176) * uVar176;
              uVar145 = ((int)uVar145 < (int)uVar179) * uVar145 |
                        ((int)uVar145 >= (int)uVar179) * uVar179;
              auVar57._4_4_ =
                   -(uint)((float)((tray.tnear.field_0.i[1] < (int)auVar136._4_4_) * auVar136._4_4_
                                  | (uint)(tray.tnear.field_0.i[1] >= (int)auVar136._4_4_) *
                                    tray.tnear.field_0.i[1]) <=
                          (float)((uint)(tray.tfar.field_0.i[1] < (int)uVar141) *
                                  tray.tfar.field_0.i[1] |
                                 (tray.tfar.field_0.i[1] >= (int)uVar141) * uVar141));
              auVar57._0_4_ =
                   -(uint)((float)((tray.tnear.field_0.i[0] < (int)auVar136._0_4_) * auVar136._0_4_
                                  | (uint)(tray.tnear.field_0.i[0] >= (int)auVar136._0_4_) *
                                    tray.tnear.field_0.i[0]) <=
                          (float)((uint)(tray.tfar.field_0.i[0] < (int)uVar30) *
                                  tray.tfar.field_0.i[0] |
                                 (tray.tfar.field_0.i[0] >= (int)uVar30) * uVar30));
              auVar57._8_4_ =
                   -(uint)((float)((tray.tnear.field_0.i[2] < (int)auVar136._8_4_) * auVar136._8_4_
                                  | (uint)(tray.tnear.field_0.i[2] >= (int)auVar136._8_4_) *
                                    tray.tnear.field_0.i[2]) <=
                          (float)((uint)(tray.tfar.field_0.i[2] < (int)uVar143) *
                                  tray.tfar.field_0.i[2] |
                                 (tray.tfar.field_0.i[2] >= (int)uVar143) * uVar143));
              auVar57._12_4_ =
                   -(uint)((float)((tray.tnear.field_0.i[3] < (int)auVar136._12_4_) *
                                   auVar136._12_4_ |
                                  (uint)(tray.tnear.field_0.i[3] >= (int)auVar136._12_4_) *
                                  tray.tnear.field_0.i[3]) <=
                          (float)((uint)(tray.tfar.field_0.i[3] < (int)uVar145) *
                                  tray.tfar.field_0.i[3] |
                                 (tray.tfar.field_0.i[3] >= (int)uVar145) * uVar145));
              uVar30 = movmskps((int)pIVar43,auVar57);
              pIVar43 = (Intersectors *)(ulong)uVar30;
              if (uVar30 == 0) {
                auVar81._4_4_ = fVar95;
                auVar81._0_4_ = fVar197;
                auVar81._8_4_ = fVar53;
                auVar81._12_4_ = fVar146;
                sVar40 = sVar44;
              }
              else {
                auVar80._4_4_ = fVar154;
                auVar80._0_4_ = fVar148;
                auVar80._8_4_ = fVar158;
                auVar80._12_4_ = fVar162;
                auVar81 = blendvps(auVar80,auVar136,auVar57);
                if (sVar44 != 8) {
                  pNVar46->ptr = sVar44;
                  pNVar46 = pNVar46 + 1;
                  (pvVar48->field_0).v[0] = fVar197;
                  (pvVar48->field_0).v[1] = fVar95;
                  (pvVar48->field_0).v[2] = fVar53;
                  (pvVar48->field_0).v[3] = fVar146;
                  pvVar48 = pvVar48 + 1;
                }
              }
              fVar197 = auVar81._0_4_;
              fVar95 = auVar81._4_4_;
              fVar53 = auVar81._8_4_;
              fVar146 = auVar81._12_4_;
              sVar44 = sVar40;
            }
            if (sVar44 == 8) goto LAB_006dda74;
            auVar58._4_4_ = -(uint)(fVar95 < tray.tfar.field_0.v[1]);
            auVar58._0_4_ = -(uint)(fVar197 < tray.tfar.field_0.v[0]);
            auVar58._8_4_ = -(uint)(fVar53 < tray.tfar.field_0.v[2]);
            auVar58._12_4_ = -(uint)(fVar146 < tray.tfar.field_0.v[3]);
            uVar31 = movmskps((int)(root.ptr & 0xfffffffffffffff0),auVar58);
            uVar30 = POPCOUNT(uVar31);
            root.ptr = sVar44;
          } while ((byte)uVar42 < (byte)uVar30);
          pNVar46->ptr = sVar44;
          pNVar46 = pNVar46 + 1;
          (pvVar48->field_0).v[0] = fVar197;
          (pvVar48->field_0).v[1] = fVar95;
          (pvVar48->field_0).v[2] = fVar53;
          (pvVar48->field_0).v[3] = fVar146;
          pvVar48 = pvVar48 + 1;
LAB_006dda74:
          uVar30 = 4;
        }
        else {
          while (uVar50 != 0) {
            pRVar37 = (RTCIntersectArguments *)0x0;
            if (uVar50 != 0) {
              for (; (uVar50 >> (long)pRVar37 & 1) == 0;
                  pRVar37 = (RTCIntersectArguments *)((long)&pRVar37->flags + 1)) {
              }
            }
            uVar50 = uVar50 & uVar50 - 1;
            pRVar36 = pRVar37;
            pIVar43 = This;
            bVar51 = occluded1(This,bvh,root,(size_t)pRVar37,&pre,ray,&tray,context);
            if (bVar51) {
              terminated.field_0.i[(long)pRVar37] = -1;
            }
          }
          uVar143 = movmskps((int)pRVar36,(undefined1  [16])terminated.field_0);
          pRVar36 = (RTCIntersectArguments *)(ulong)uVar143;
          uVar30 = 3;
          fVar148 = INFINITY;
          fVar154 = INFINITY;
          fVar158 = INFINITY;
          fVar162 = INFINITY;
          if (uVar143 != 0xf) {
            tray.tfar.field_0 =
                 (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                 blendvps((undefined1  [16])tray.tfar.field_0,_DAT_01f45a40,
                          (undefined1  [16])terminated.field_0);
            uVar30 = 2;
          }
          if (uVar42 < (uint)POPCOUNT(uVar141)) goto LAB_006dd8d6;
        }
        pvVar47 = pvVar48;
      } while ((uVar30 == 4) || (uVar30 == 2));
LAB_006df4a2:
      auVar73._0_4_ = uVar181 & terminated.field_0.i[0];
      auVar73._4_4_ = uVar184 & terminated.field_0.i[1];
      auVar73._8_4_ = auVar183._8_4_ & terminated.field_0.i[2];
      auVar73._12_4_ = auVar183._12_4_ & terminated.field_0.i[3];
      auVar89 = blendvps(*(undefined1 (*) [16])(ray + 0x80),_DAT_01f45a40,auVar73);
      *(undefined1 (*) [16])(ray + 0x80) = auVar89;
      return;
    }
  }
  return;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded(vint<K>* __restrict__ valid_i,
                                                                                              Accel::Intersectors* __restrict__ This,
                                                                                              RayK<K>& __restrict__ ray,
                                                                                              RayQueryContext* context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
#if ENABLE_FAST_COHERENT_CODEPATHS == 1
      assert(context);
      if (unlikely(types == BVH_AN1 && context->user && context->isCoherent()))
      {
        occludedCoherent(valid_i, This, ray, context);
        return;
      }
#endif

      /* filter out already occluded and invalid rays */
      vbool<K> valid = (*valid_i == -1) & (ray.tfar >= 0.0f);
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      const size_t valid_bits = movemask(valid);
      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid, ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      tray.tnear = select(valid, org_ray_tnear, vfloat<K>(pos_inf));
      tray.tfar  = select(valid, org_ray_tfar , vfloat<K>(neg_inf));

      vbool<K> terminated = !valid;
      const vfloat<K> inf = vfloat<K>(pos_inf);

      /* determine switch threshold based on flags */
      const size_t switchThreshold = (context->user && context->isCoherent()) ? 2 : switchThresholdIncoherent;

      /* allocate stack and push root node */
      vfloat<K> stack_near[stackSizeChunk];
      NodeRef stack_node[stackSizeChunk];
      stack_node[0] = BVH::invalidNode;
      stack_near[0] = inf;
      stack_node[1] = bvh->root;
      stack_near[1] = tray.tnear;
      NodeRef* stackEnd MAYBE_UNUSED = stack_node+stackSizeChunk;
      NodeRef* __restrict__ sptr_node = stack_node + 2;
      vfloat<K>* __restrict__ sptr_near = stack_near + 2;

      while (1) pop:
      {
        /* pop next node from stack */
        assert(sptr_node > stack_node);
        sptr_node--;
        sptr_near--;
        NodeRef cur = *sptr_node;
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }

        /* cull node if behind closest hit point */
        vfloat<K> curDist = *sptr_near;
        const vbool<K> active = curDist < tray.tfar;
        if (unlikely(none(active)))
          continue;

        /* switch to single ray traversal */
#if (!defined(__WIN32__) || defined(__X86_64__)) && ((defined(__aarch64__)) || defined(__SSE4_2__))
#if FORCE_SINGLE_MODE == 0
        if (single)
#endif
        {
          size_t bits = movemask(active);
#if FORCE_SINGLE_MODE == 0
          if (unlikely(popcnt(bits) <= switchThreshold)) 
#endif
          {
            for (; bits!=0; ) {
              const size_t i = bscf(bits);
              if (occluded1(This, bvh, cur, i, pre, ray, tray, context))
                set(terminated, i);
            }
            if (all(terminated)) break;
            tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar);
            continue;
          }
        }
#endif

        while (likely(!cur.isLeaf()))
        {
          /* process nodes */
          const vbool<K> valid_node = tray.tfar > curDist;
          STAT3(shadow.trav_nodes, 1, popcnt(valid_node), K);
          const NodeRef nodeRef = cur;
          const BaseNode* __restrict__ const node = nodeRef.baseNode();

          /* set cur to invalid */
          cur = BVH::emptyNode;
          curDist = pos_inf;

          for (unsigned i = 0; i < N; i++)
          {
            const NodeRef child = node->children[i];
            if (unlikely(child == BVH::emptyNode)) break;
            vfloat<K> lnearP;
            vbool<K> lhit = valid_node;
            BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

            /* if we hit the child we push the previously hit node onto the stack, and continue with the currently hit child */
            if (likely(any(lhit)))
            {
              assert(sptr_node < stackEnd);
              assert(child != BVH::emptyNode);
              const vfloat<K> childDist = select(lhit, lnearP, inf);

              /* push 'cur' node onto stack and continue with hit child */
              if (likely(cur != BVH::emptyNode)) {
                *sptr_node = cur; sptr_node++;
                *sptr_near = curDist; sptr_near++;
              }
              curDist = childDist;
              cur = child;
            }
          }
          if (unlikely(cur == BVH::emptyNode))
            goto pop;

#if SWITCH_DURING_DOWN_TRAVERSAL == 1
          if (single)
          {
            // seems to be the best place for testing utilization
            if (unlikely(popcnt(tray.tfar > curDist) <= switchThreshold))
            {
              *sptr_node++ = cur;
              *sptr_near++ = curDist;
              goto pop;
            }
          }
#endif
	}

        /* return if stack is empty */
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }


        /* intersect leaf */
        assert(cur != BVH::emptyNode);
        const vbool<K> valid_leaf = tray.tfar > curDist;
        STAT3(shadow.trav_leaves, 1, popcnt(valid_leaf), K);
        if (unlikely(none(valid_leaf))) continue;
        size_t items; const Primitive* prim = (Primitive*) cur.leaf(items);

        size_t lazy_node = 0;
        terminated |= PrimitiveIntersectorK::occluded(!terminated, This, pre, ray, context, prim, items, tray, lazy_node);
        if (all(terminated)) break;
        tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar); // ignore node intersections for terminated rays

        if (unlikely(lazy_node)) {
          *sptr_node = lazy_node; sptr_node++;
          *sptr_near = neg_inf;   sptr_near++;
        }
      }

      vfloat<K>::store(valid & terminated, &ray.tfar, neg_inf);
    }